

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  ulong uVar70;
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  int iVar74;
  ulong uVar75;
  uint uVar76;
  long lVar77;
  byte bVar78;
  undefined1 uVar79;
  undefined1 uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar146;
  uint uVar147;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  uint uVar148;
  uint uVar152;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar145 [32];
  float fVar153;
  float fVar154;
  vint4 bi_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar167;
  float fVar168;
  undefined4 uVar169;
  float fVar187;
  float fVar189;
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar183 [32];
  undefined1 auVar172 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  vint4 ai_2;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  vint4 ai;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  vint4 ai_1;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [28];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 (*local_a68) [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar5 = prim[1];
  uVar70 = (ulong)(byte)PVar5;
  fVar153 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar85 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar221._0_4_ = fVar153 * auVar85._0_4_;
  auVar221._4_4_ = fVar153 * auVar85._4_4_;
  auVar221._8_4_ = fVar153 * auVar85._8_4_;
  auVar221._12_4_ = fVar153 * auVar85._12_4_;
  auVar96._0_4_ = fVar153 * auVar83._0_4_;
  auVar96._4_4_ = fVar153 * auVar83._4_4_;
  auVar96._8_4_ = fVar153 * auVar83._8_4_;
  auVar96._12_4_ = fVar153 * auVar83._12_4_;
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar70 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar73 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar70 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar75 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar266._4_4_ = auVar96._0_4_;
  auVar266._0_4_ = auVar96._0_4_;
  auVar266._8_4_ = auVar96._0_4_;
  auVar266._12_4_ = auVar96._0_4_;
  auVar92 = vshufps_avx(auVar96,auVar96,0x55);
  auVar84 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar153 = auVar84._0_4_;
  auVar199._0_4_ = fVar153 * auVar88._0_4_;
  fVar167 = auVar84._4_4_;
  auVar199._4_4_ = fVar167 * auVar88._4_4_;
  fVar187 = auVar84._8_4_;
  auVar199._8_4_ = fVar187 * auVar88._8_4_;
  fVar189 = auVar84._12_4_;
  auVar199._12_4_ = fVar189 * auVar88._12_4_;
  auVar170._0_4_ = auVar94._0_4_ * fVar153;
  auVar170._4_4_ = auVar94._4_4_ * fVar167;
  auVar170._8_4_ = auVar94._8_4_ * fVar187;
  auVar170._12_4_ = auVar94._12_4_ * fVar189;
  auVar97._0_4_ = auVar91._0_4_ * fVar153;
  auVar97._4_4_ = auVar91._4_4_ * fVar167;
  auVar97._8_4_ = auVar91._8_4_ * fVar187;
  auVar97._12_4_ = auVar91._12_4_ * fVar189;
  auVar84 = vfmadd231ps_fma(auVar199,auVar92,auVar83);
  auVar95 = vfmadd231ps_fma(auVar170,auVar92,auVar86);
  auVar92 = vfmadd231ps_fma(auVar97,auVar87,auVar92);
  auVar93 = vfmadd231ps_fma(auVar84,auVar266,auVar85);
  auVar95 = vfmadd231ps_fma(auVar95,auVar266,auVar89);
  auVar96 = vfmadd231ps_fma(auVar92,auVar90,auVar266);
  auVar267._4_4_ = auVar221._0_4_;
  auVar267._0_4_ = auVar221._0_4_;
  auVar267._8_4_ = auVar221._0_4_;
  auVar267._12_4_ = auVar221._0_4_;
  auVar92 = vshufps_avx(auVar221,auVar221,0x55);
  auVar84 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar153 = auVar84._0_4_;
  auVar268._0_4_ = fVar153 * auVar88._0_4_;
  fVar167 = auVar84._4_4_;
  auVar268._4_4_ = fVar167 * auVar88._4_4_;
  fVar187 = auVar84._8_4_;
  auVar268._8_4_ = fVar187 * auVar88._8_4_;
  fVar189 = auVar84._12_4_;
  auVar268._12_4_ = fVar189 * auVar88._12_4_;
  auVar236._0_4_ = auVar94._0_4_ * fVar153;
  auVar236._4_4_ = auVar94._4_4_ * fVar167;
  auVar236._8_4_ = auVar94._8_4_ * fVar187;
  auVar236._12_4_ = auVar94._12_4_ * fVar189;
  auVar222._0_4_ = auVar91._0_4_ * fVar153;
  auVar222._4_4_ = auVar91._4_4_ * fVar167;
  auVar222._8_4_ = auVar91._8_4_ * fVar187;
  auVar222._12_4_ = auVar91._12_4_ * fVar189;
  auVar83 = vfmadd231ps_fma(auVar268,auVar92,auVar83);
  auVar88 = vfmadd231ps_fma(auVar236,auVar92,auVar86);
  auVar86 = vfmadd231ps_fma(auVar222,auVar92,auVar87);
  auVar94 = vfmadd231ps_fma(auVar83,auVar267,auVar85);
  auVar87 = vfmadd231ps_fma(auVar88,auVar267,auVar89);
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar91 = vfmadd231ps_fma(auVar86,auVar267,auVar90);
  auVar85 = vandps_avx(auVar93,auVar260);
  auVar251._8_4_ = 0x219392ef;
  auVar251._0_8_ = 0x219392ef219392ef;
  auVar251._12_4_ = 0x219392ef;
  uVar73 = vcmpps_avx512vl(auVar85,auVar251,1);
  bVar10 = (bool)((byte)uVar73 & 1);
  auVar84._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar93._0_4_;
  bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar93._4_4_;
  bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar93._8_4_;
  bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar93._12_4_;
  auVar85 = vandps_avx(auVar95,auVar260);
  uVar73 = vcmpps_avx512vl(auVar85,auVar251,1);
  bVar10 = (bool)((byte)uVar73 & 1);
  auVar93._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar95._0_4_;
  bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar95._4_4_;
  bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar95._8_4_;
  bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar95._12_4_;
  auVar85 = vandps_avx(auVar96,auVar260);
  uVar73 = vcmpps_avx512vl(auVar85,auVar251,1);
  bVar10 = (bool)((byte)uVar73 & 1);
  auVar95._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar96._0_4_;
  bVar10 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar96._4_4_;
  bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar96._8_4_;
  bVar10 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar96._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar84);
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar84,auVar83,auVar252);
  auVar89 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar93);
  auVar85 = vfnmadd213ps_fma(auVar93,auVar83,auVar252);
  auVar86 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar95);
  auVar85 = vfnmadd213ps_fma(auVar95,auVar83,auVar252);
  auVar90 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar94);
  auVar244._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar244._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar244._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar244._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar85 = vpmovsxwd_avx(auVar83);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar94);
  auVar84 = vpbroadcastd_avx512vl();
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar88);
  auVar200._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar200._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar200._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar200._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar70 * -2 + 6);
  auVar85 = vpmovsxwd_avx(auVar89);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar87);
  auVar253._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar253._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar253._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar253._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,auVar87);
  auVar171._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar171._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar171._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar171._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar75 + uVar70 + 6);
  auVar85 = vpmovsxwd_avx(auVar86);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar91);
  auVar237._0_4_ = auVar90._0_4_ * auVar85._0_4_;
  auVar237._4_4_ = auVar90._4_4_ * auVar85._4_4_;
  auVar237._8_4_ = auVar90._8_4_ * auVar85._8_4_;
  auVar237._12_4_ = auVar90._12_4_ * auVar85._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar85 = vpmovsxwd_avx(auVar94);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar91);
  auVar155._0_4_ = auVar90._0_4_ * auVar85._0_4_;
  auVar155._4_4_ = auVar90._4_4_ * auVar85._4_4_;
  auVar155._8_4_ = auVar90._8_4_ * auVar85._8_4_;
  auVar155._12_4_ = auVar90._12_4_ * auVar85._12_4_;
  auVar85 = vpminsd_avx(auVar244,auVar200);
  auVar83 = vpminsd_avx(auVar253,auVar171);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx(auVar237,auVar155);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar90._4_4_ = uVar169;
  auVar90._0_4_ = uVar169;
  auVar90._8_4_ = uVar169;
  auVar90._12_4_ = uVar169;
  auVar83 = vmaxps_avx512vl(auVar83,auVar90);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_660 = vmulps_avx512vl(auVar85,auVar87);
  auVar85 = vpmaxsd_avx(auVar244,auVar200);
  auVar83 = vpmaxsd_avx(auVar253,auVar171);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx(auVar237,auVar155);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar91._4_4_ = uVar169;
  auVar91._0_4_ = uVar169;
  auVar91._8_4_ = uVar169;
  auVar91._12_4_ = uVar169;
  auVar83 = vminps_avx512vl(auVar83,auVar91);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar92);
  uVar26 = vcmpps_avx512vl(local_660,auVar85,2);
  local_928 = vpcmpgtd_avx512vl(auVar84,_DAT_01f7fcf0);
  local_928 = ((byte)uVar26 & 0xf) & local_928;
  if ((char)local_928 == '\0') {
    return;
  }
  local_a68 = (undefined1 (*) [32])local_240;
  auVar166 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar166);
  local_930 = prim;
LAB_01afcec9:
  lVar77 = 0;
  for (uVar73 = local_928; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    lVar77 = lVar77 + 1;
  }
  uVar76 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar77 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar76].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar77 = *(long *)&pGVar7[1].time_range.upper;
  auVar85 = *(undefined1 (*) [16])(lVar77 + (long)p_Var8 * uVar73);
  auVar83 = *(undefined1 (*) [16])(lVar77 + (uVar73 + 1) * (long)p_Var8);
  auVar88 = *(undefined1 (*) [16])(lVar77 + (uVar73 + 2) * (long)p_Var8);
  local_928 = local_928 - 1 & local_928;
  auVar89 = *(undefined1 (*) [16])(lVar77 + (uVar73 + 3) * (long)p_Var8);
  if (local_928 != 0) {
    uVar75 = local_928 - 1 & local_928;
    for (uVar73 = local_928; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    }
    if (uVar75 != 0) {
      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar94 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  _local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar86 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar91 = local_7a0._0_16_;
  local_a10 = vinsertps_avx512f(auVar86,auVar91,0x28);
  auVar245._0_4_ = auVar85._0_4_ + auVar83._0_4_ + auVar88._0_4_ + auVar89._0_4_;
  auVar245._4_4_ = auVar85._4_4_ + auVar83._4_4_ + auVar88._4_4_ + auVar89._4_4_;
  auVar245._8_4_ = auVar85._8_4_ + auVar83._8_4_ + auVar88._8_4_ + auVar89._8_4_;
  auVar245._12_4_ = auVar85._12_4_ + auVar83._12_4_ + auVar88._12_4_ + auVar89._12_4_;
  auVar29._8_4_ = 0x3e800000;
  auVar29._0_8_ = 0x3e8000003e800000;
  auVar29._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar245,auVar29);
  auVar86 = vsubps_avx(auVar86,auVar94);
  auVar86 = vdpps_avx(auVar86,local_a10,0x7f);
  fVar153 = *(float *)(ray + k * 4 + 0xc0);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar254._4_12_ = ZEXT812(0) << 0x20;
  auVar254._0_4_ = local_a20._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar254);
  auVar90 = vfnmadd213ss_fma(auVar87,local_a20,ZEXT416(0x40000000));
  local_5a0 = auVar86._0_4_ * auVar87._0_4_ * auVar90._0_4_;
  auVar255._4_4_ = local_5a0;
  auVar255._0_4_ = local_5a0;
  auVar255._8_4_ = local_5a0;
  auVar255._12_4_ = local_5a0;
  fStack_9d0 = local_5a0;
  _local_9e0 = auVar255;
  fStack_9cc = local_5a0;
  fStack_9c8 = local_5a0;
  fStack_9c4 = local_5a0;
  auVar86 = vfmadd231ps_fma(auVar94,local_a10,auVar255);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar88 = vsubps_avx(auVar88,auVar86);
  auVar83 = vsubps_avx(auVar83,auVar86);
  auVar89 = vsubps_avx(auVar89,auVar86);
  auVar98 = vbroadcastss_avx512vl(auVar85);
  auVar272 = ZEXT3264(auVar98);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  local_8a0 = ZEXT1632(auVar85);
  auVar98 = vpermps_avx2(auVar104,local_8a0);
  auVar105._8_4_ = 2;
  auVar105._0_8_ = 0x200000002;
  auVar105._12_4_ = 2;
  auVar105._16_4_ = 2;
  auVar105._20_4_ = 2;
  auVar105._24_4_ = 2;
  auVar105._28_4_ = 2;
  auVar24 = vpermps_avx2(auVar105,local_8a0);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar99 = vpermps_avx512vl(auVar108,local_8a0);
  uVar169 = auVar83._0_4_;
  local_880._4_4_ = uVar169;
  local_880._0_4_ = uVar169;
  local_880._8_4_ = uVar169;
  local_880._12_4_ = uVar169;
  local_880._16_4_ = uVar169;
  local_880._20_4_ = uVar169;
  local_880._24_4_ = uVar169;
  local_880._28_4_ = uVar169;
  auVar259 = ZEXT3264(local_880);
  local_8e0 = ZEXT1632(auVar83);
  local_a00 = vpermps_avx2(auVar104,local_8e0);
  auVar243 = ZEXT3264(local_a00);
  auVar25 = vpermps_avx2(auVar105,local_8e0);
  auVar100 = vpermps_avx512vl(auVar108,local_8e0);
  auVar101 = vbroadcastss_avx512vl(auVar88);
  local_8c0 = ZEXT1632(auVar88);
  auVar102 = vpermps_avx512vl(auVar104,local_8c0);
  local_ac0 = vpermps_avx512vl(auVar105,local_8c0);
  auVar269 = ZEXT3264(local_ac0);
  auVar103 = vpermps_avx512vl(auVar108,local_8c0);
  local_ae0 = vbroadcastss_avx512vl(auVar89);
  auVar270 = ZEXT3264(local_ae0);
  _local_900 = ZEXT1632(auVar89);
  auVar104 = vpermps_avx512vl(auVar104,_local_900);
  auVar105 = vpermps_avx512vl(auVar105,_local_900);
  local_b00 = vpermps_avx512vl(auVar108,_local_900);
  auVar271 = ZEXT3264(local_b00);
  auVar85 = vmulss_avx512f(auVar91,auVar91);
  auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar106,_local_760,_local_760);
  local_560._0_4_ = local_580._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar106);
  local_990 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar153 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar166 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar166);
  iVar74 = 1;
  uVar73 = 0;
  auVar166 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar166);
  auVar85 = vsqrtss_avx(local_a20,local_a20);
  auVar83 = vsqrtss_avx(local_a20,local_a20);
  local_650 = ZEXT816(0x3f80000000000000);
  do {
    auVar88 = vmovshdup_avx(local_650);
    auVar88 = vsubps_avx(auVar88,local_650);
    fVar167 = auVar88._0_4_;
    fVar154 = fVar167 * 0.04761905;
    auVar235._0_4_ = local_650._0_4_;
    auVar235._4_4_ = auVar235._0_4_;
    auVar235._8_4_ = auVar235._0_4_;
    auVar235._12_4_ = auVar235._0_4_;
    auVar235._16_4_ = auVar235._0_4_;
    auVar235._20_4_ = auVar235._0_4_;
    auVar235._24_4_ = auVar235._0_4_;
    auVar235._28_4_ = auVar235._0_4_;
    auVar250._4_4_ = fVar167;
    auVar250._0_4_ = fVar167;
    auVar250._8_4_ = fVar167;
    auVar250._12_4_ = fVar167;
    auVar250._16_4_ = fVar167;
    auVar250._20_4_ = fVar167;
    auVar250._24_4_ = fVar167;
    auVar250._28_4_ = fVar167;
    auVar88 = vfmadd231ps_fma(auVar235,auVar250,_DAT_01faff20);
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar106 = vsubps_avx512vl(auVar107,ZEXT1632(auVar88));
    fVar167 = auVar88._0_4_;
    fVar187 = auVar88._4_4_;
    auVar123._4_4_ = auVar259._4_4_ * fVar187;
    auVar123._0_4_ = auVar259._0_4_ * fVar167;
    fVar189 = auVar88._8_4_;
    auVar123._8_4_ = auVar259._8_4_ * fVar189;
    fVar191 = auVar88._12_4_;
    auVar123._12_4_ = auVar259._12_4_ * fVar191;
    auVar123._16_4_ = auVar259._16_4_ * 0.0;
    auVar123._20_4_ = auVar259._20_4_ * 0.0;
    auVar123._24_4_ = auVar259._24_4_ * 0.0;
    auVar123._28_4_ = DAT_01faff20._28_4_;
    auVar110._4_4_ = auVar243._4_4_ * fVar187;
    auVar110._0_4_ = auVar243._0_4_ * fVar167;
    auVar110._8_4_ = auVar243._8_4_ * fVar189;
    auVar110._12_4_ = auVar243._12_4_ * fVar191;
    auVar110._16_4_ = auVar243._16_4_ * 0.0;
    auVar110._20_4_ = auVar243._20_4_ * 0.0;
    auVar110._24_4_ = auVar243._24_4_ * 0.0;
    auVar110._28_4_ = auVar235._0_4_;
    auVar166._0_4_ = auVar25._0_4_ * fVar167;
    auVar166._4_4_ = auVar25._4_4_ * fVar187;
    auVar166._8_4_ = auVar25._8_4_ * fVar189;
    auVar166._12_4_ = auVar25._12_4_ * fVar191;
    auVar166._16_4_ = auVar25._16_4_ * 0.0;
    auVar166._20_4_ = auVar25._20_4_ * 0.0;
    auVar166._28_36_ = auVar243._28_36_;
    auVar166._24_4_ = auVar25._24_4_ * 0.0;
    auVar108 = vmulps_avx512vl(auVar100,ZEXT1632(auVar88));
    local_a60 = auVar272._0_32_;
    auVar109 = vfmadd231ps_avx512vl(auVar123,auVar106,local_a60);
    auVar89 = vfmadd231ps_fma(auVar110,auVar106,auVar98);
    auVar86 = vfmadd231ps_fma(auVar166._0_32_,auVar106,auVar24);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar99);
    auVar110 = vmulps_avx512vl(auVar101,ZEXT1632(auVar88));
    auVar117 = ZEXT1632(auVar88);
    auVar111 = vmulps_avx512vl(auVar102,auVar117);
    auVar112 = vmulps_avx512vl(auVar269._0_32_,auVar117);
    auVar113 = vmulps_avx512vl(auVar103,auVar117);
    auVar94 = vfmadd231ps_fma(auVar110,auVar106,auVar259._0_32_);
    auVar90 = vfmadd231ps_fma(auVar111,auVar106,auVar243._0_32_);
    auVar87 = vfmadd231ps_fma(auVar112,auVar106,auVar25);
    auVar110 = vfmadd231ps_avx512vl(auVar113,auVar106,auVar100);
    auVar111 = vmulps_avx512vl(auVar270._0_32_,auVar117);
    auVar112 = vmulps_avx512vl(auVar104,auVar117);
    auVar113 = vmulps_avx512vl(auVar105,auVar117);
    auVar114 = vmulps_avx512vl(auVar271._0_32_,auVar117);
    auVar115 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar101);
    auVar116 = vfmadd231ps_avx512vl(auVar112,auVar106,auVar102);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,auVar269._0_32_);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,auVar103);
    auVar124._28_4_ = auVar25._28_4_;
    auVar124._0_28_ =
         ZEXT1628(CONCAT412(fVar191 * auVar94._12_4_,
                            CONCAT48(fVar189 * auVar94._8_4_,
                                     CONCAT44(fVar187 * auVar94._4_4_,fVar167 * auVar94._0_4_))));
    auVar111 = vmulps_avx512vl(auVar117,ZEXT1632(auVar90));
    auVar112 = vmulps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87));
    auVar117 = vmulps_avx512vl(ZEXT1632(auVar88),auVar110);
    auVar88 = vfmadd231ps_fma(auVar124,auVar106,auVar109);
    auVar118 = vfmadd231ps_avx512vl(auVar111,auVar106,ZEXT1632(auVar89));
    auVar119 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar86));
    auVar120 = vfmadd231ps_avx512vl(auVar117,auVar106,auVar108);
    auVar111._4_4_ = auVar115._4_4_ * fVar187;
    auVar111._0_4_ = auVar115._0_4_ * fVar167;
    auVar111._8_4_ = auVar115._8_4_ * fVar189;
    auVar111._12_4_ = auVar115._12_4_ * fVar191;
    auVar111._16_4_ = auVar115._16_4_ * 0.0;
    auVar111._20_4_ = auVar115._20_4_ * 0.0;
    auVar111._24_4_ = auVar115._24_4_ * 0.0;
    auVar111._28_4_ = auVar108._28_4_;
    auVar112._4_4_ = auVar116._4_4_ * fVar187;
    auVar112._0_4_ = auVar116._0_4_ * fVar167;
    auVar112._8_4_ = auVar116._8_4_ * fVar189;
    auVar112._12_4_ = auVar116._12_4_ * fVar191;
    auVar112._16_4_ = auVar116._16_4_ * 0.0;
    auVar112._20_4_ = auVar116._20_4_ * 0.0;
    auVar112._24_4_ = auVar116._24_4_ * 0.0;
    auVar112._28_4_ = auVar115._28_4_;
    auVar117._4_4_ = auVar113._4_4_ * fVar187;
    auVar117._0_4_ = auVar113._0_4_ * fVar167;
    auVar117._8_4_ = auVar113._8_4_ * fVar189;
    auVar117._12_4_ = auVar113._12_4_ * fVar191;
    auVar117._16_4_ = auVar113._16_4_ * 0.0;
    auVar117._20_4_ = auVar113._20_4_ * 0.0;
    auVar117._24_4_ = auVar113._24_4_ * 0.0;
    auVar117._28_4_ = auVar116._28_4_;
    auVar121._4_4_ = auVar114._4_4_ * fVar187;
    auVar121._0_4_ = auVar114._0_4_ * fVar167;
    auVar121._8_4_ = auVar114._8_4_ * fVar189;
    auVar121._12_4_ = auVar114._12_4_ * fVar191;
    auVar121._16_4_ = auVar114._16_4_ * 0.0;
    auVar121._20_4_ = auVar114._20_4_ * 0.0;
    auVar121._24_4_ = auVar114._24_4_ * 0.0;
    auVar121._28_4_ = auVar113._28_4_;
    auVar89 = vfmadd231ps_fma(auVar111,auVar106,ZEXT1632(auVar94));
    auVar86 = vfmadd231ps_fma(auVar112,auVar106,ZEXT1632(auVar90));
    auVar94 = vfmadd231ps_fma(auVar117,auVar106,ZEXT1632(auVar87));
    auVar90 = vfmadd231ps_fma(auVar121,auVar106,auVar110);
    auVar122._28_4_ = auVar109._28_4_;
    auVar122._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar191,
                            CONCAT48(auVar94._8_4_ * fVar189,
                                     CONCAT44(auVar94._4_4_ * fVar187,auVar94._0_4_ * fVar167))));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar191 * auVar89._12_4_,
                                                 CONCAT48(fVar189 * auVar89._8_4_,
                                                          CONCAT44(fVar187 * auVar89._4_4_,
                                                                   fVar167 * auVar89._0_4_)))),
                              auVar106,ZEXT1632(auVar88));
    auVar117 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar191,
                                             CONCAT48(auVar86._8_4_ * fVar189,
                                                      CONCAT44(auVar86._4_4_ * fVar187,
                                                               auVar86._0_4_ * fVar167)))),auVar106,
                          auVar118);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar106,auVar119);
    auVar108 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar90._12_4_ * fVar191,
                                             CONCAT48(auVar90._8_4_ * fVar189,
                                                      CONCAT44(auVar90._4_4_ * fVar187,
                                                               auVar90._0_4_ * fVar167)))),auVar120,
                          auVar106);
    auVar106 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar88));
    auVar110 = vsubps_avx512vl(ZEXT1632(auVar86),auVar118);
    auVar111 = vsubps_avx512vl(ZEXT1632(auVar94),auVar119);
    auVar112 = vsubps_avx512vl(ZEXT1632(auVar90),auVar120);
    auVar135._0_4_ = fVar154 * auVar106._0_4_ * 3.0;
    auVar135._4_4_ = fVar154 * auVar106._4_4_ * 3.0;
    auVar135._8_4_ = fVar154 * auVar106._8_4_ * 3.0;
    auVar135._12_4_ = fVar154 * auVar106._12_4_ * 3.0;
    auVar135._16_4_ = fVar154 * auVar106._16_4_ * 3.0;
    auVar135._20_4_ = fVar154 * auVar106._20_4_ * 3.0;
    auVar135._24_4_ = fVar154 * auVar106._24_4_ * 3.0;
    auVar135._28_4_ = 0;
    auVar136._0_4_ = fVar154 * auVar110._0_4_ * 3.0;
    auVar136._4_4_ = fVar154 * auVar110._4_4_ * 3.0;
    auVar136._8_4_ = fVar154 * auVar110._8_4_ * 3.0;
    auVar136._12_4_ = fVar154 * auVar110._12_4_ * 3.0;
    auVar136._16_4_ = fVar154 * auVar110._16_4_ * 3.0;
    auVar136._20_4_ = fVar154 * auVar110._20_4_ * 3.0;
    auVar136._24_4_ = fVar154 * auVar110._24_4_ * 3.0;
    auVar136._28_4_ = 0;
    auVar118._4_4_ = fVar154 * auVar111._4_4_ * 3.0;
    auVar118._0_4_ = fVar154 * auVar111._0_4_ * 3.0;
    auVar118._8_4_ = fVar154 * auVar111._8_4_ * 3.0;
    auVar118._12_4_ = fVar154 * auVar111._12_4_ * 3.0;
    auVar118._16_4_ = fVar154 * auVar111._16_4_ * 3.0;
    auVar118._20_4_ = fVar154 * auVar111._20_4_ * 3.0;
    auVar118._24_4_ = fVar154 * auVar111._24_4_ * 3.0;
    auVar118._28_4_ = auVar114._28_4_;
    fVar167 = auVar112._0_4_ * 3.0 * fVar154;
    fVar187 = auVar112._4_4_ * 3.0 * fVar154;
    auVar119._4_4_ = fVar187;
    auVar119._0_4_ = fVar167;
    fVar189 = auVar112._8_4_ * 3.0 * fVar154;
    auVar119._8_4_ = fVar189;
    fVar191 = auVar112._12_4_ * 3.0 * fVar154;
    auVar119._12_4_ = fVar191;
    fVar193 = auVar112._16_4_ * 3.0 * fVar154;
    auVar119._16_4_ = fVar193;
    fVar195 = auVar112._20_4_ * 3.0 * fVar154;
    auVar119._20_4_ = fVar195;
    fVar197 = auVar112._24_4_ * 3.0 * fVar154;
    auVar119._24_4_ = fVar197;
    auVar119._28_4_ = fVar154;
    auVar88 = vxorps_avx512vl(auVar271._0_16_,auVar271._0_16_);
    auVar122 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_01feed00,ZEXT1632(auVar88));
    auVar123 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,ZEXT1632(auVar88));
    auVar110 = ZEXT1632(auVar88);
    auVar124 = vpermt2ps_avx512vl(auVar121,_DAT_01feed00,auVar110);
    auVar125._0_4_ = auVar108._0_4_ + fVar167;
    auVar125._4_4_ = auVar108._4_4_ + fVar187;
    auVar125._8_4_ = auVar108._8_4_ + fVar189;
    auVar125._12_4_ = auVar108._12_4_ + fVar191;
    auVar125._16_4_ = auVar108._16_4_ + fVar193;
    auVar125._20_4_ = auVar108._20_4_ + fVar195;
    auVar125._24_4_ = auVar108._24_4_ + fVar197;
    auVar125._28_4_ = auVar108._28_4_ + fVar154;
    auVar106 = vmaxps_avx(auVar108,auVar125);
    auVar109 = vminps_avx512vl(auVar108,auVar125);
    auVar113 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar110);
    auVar125 = vpermt2ps_avx512vl(auVar135,_DAT_01feed00,auVar110);
    auVar126 = vpermt2ps_avx512vl(auVar136,_DAT_01feed00,auVar110);
    auVar132 = ZEXT1632(auVar88);
    auVar127 = vpermt2ps_avx512vl(auVar118,_DAT_01feed00,auVar132);
    auVar108 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar132);
    auVar108 = vsubps_avx(auVar113,auVar108);
    auVar110 = vsubps_avx(auVar122,ZEXT1632(auVar87));
    auVar111 = vsubps_avx(auVar123,auVar117);
    auVar112 = vsubps_avx(auVar124,auVar121);
    auVar114 = vmulps_avx512vl(auVar111,auVar118);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar136,auVar112);
    auVar115 = vmulps_avx512vl(auVar112,auVar135);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar118,auVar110);
    auVar116 = vmulps_avx512vl(auVar110,auVar136);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar135,auVar111);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar112,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,auVar110);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar119 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar107);
    auVar116 = vfmadd132ps_avx512vl(auVar119,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar116);
    auVar119 = vmulps_avx512vl(auVar111,auVar127);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar126,auVar112);
    auVar120 = vmulps_avx512vl(auVar112,auVar125);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar127,auVar110);
    auVar128 = vmulps_avx512vl(auVar110,auVar126);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar125,auVar111);
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar120 = vfmadd231ps_avx512vl(auVar128,auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar116 = vmulps_avx512vl(auVar119,auVar116);
    auVar114 = vmaxps_avx512vl(auVar114,auVar116);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar116 = vmaxps_avx512vl(auVar108,auVar113);
    auVar106 = vmaxps_avx512vl(auVar106,auVar116);
    auVar116 = vaddps_avx512vl(auVar114,auVar106);
    auVar106 = vminps_avx(auVar108,auVar113);
    auVar106 = vminps_avx512vl(auVar109,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar114);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar108 = vmulps_avx512vl(auVar116,auVar109);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    local_aa0 = vmulps_avx512vl(auVar106,auVar113);
    auVar106 = vmulps_avx512vl(auVar108,auVar108);
    auVar108 = vrsqrt14ps_avx512vl(auVar115);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar115,auVar114);
    fVar167 = auVar108._0_4_;
    fVar187 = auVar108._4_4_;
    fVar189 = auVar108._8_4_;
    fVar191 = auVar108._12_4_;
    fVar154 = auVar108._16_4_;
    fVar193 = auVar108._20_4_;
    fVar195 = auVar108._24_4_;
    auVar120._4_4_ = fVar187 * fVar187 * fVar187 * auVar109._4_4_;
    auVar120._0_4_ = fVar167 * fVar167 * fVar167 * auVar109._0_4_;
    auVar120._8_4_ = fVar189 * fVar189 * fVar189 * auVar109._8_4_;
    auVar120._12_4_ = fVar191 * fVar191 * fVar191 * auVar109._12_4_;
    auVar120._16_4_ = fVar154 * fVar154 * fVar154 * auVar109._16_4_;
    auVar120._20_4_ = fVar193 * fVar193 * fVar193 * auVar109._20_4_;
    auVar120._24_4_ = fVar195 * fVar195 * fVar195 * auVar109._24_4_;
    auVar120._28_4_ = auVar116._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar108 = vfmadd231ps_avx512vl(auVar120,auVar108,auVar115);
    auVar109 = vmulps_avx512vl(auVar110,auVar108);
    auVar113 = vmulps_avx512vl(auVar111,auVar108);
    auVar114 = vmulps_avx512vl(auVar112,auVar108);
    auVar242 = ZEXT1632(auVar87);
    auVar115 = vsubps_avx512vl(auVar132,auVar242);
    auVar119 = vsubps_avx512vl(auVar132,auVar117);
    auVar120 = vsubps_avx512vl(auVar132,auVar121);
    auVar116 = vmulps_avx512vl(local_7a0,auVar120);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_780,auVar119);
    auVar116 = vfmadd231ps_avx512vl(auVar116,_local_760,auVar115);
    auVar128 = vmulps_avx512vl(auVar120,auVar120);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar119,auVar119);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar115,auVar115);
    auVar129 = vmulps_avx512vl(local_7a0,auVar114);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar113,local_780);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar109,_local_760);
    auVar114 = vmulps_avx512vl(auVar120,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar119,auVar113);
    auVar109 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar109);
    auVar113 = vmulps_avx512vl(auVar129,auVar129);
    auVar114 = vsubps_avx512vl(local_560,auVar113);
    auVar130 = vmulps_avx512vl(auVar129,auVar109);
    auVar116 = vsubps_avx512vl(auVar116,auVar130);
    auVar130 = vaddps_avx512vl(auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar109,auVar109);
    auVar128 = vsubps_avx512vl(auVar128,auVar116);
    auVar106 = vsubps_avx512vl(auVar128,auVar106);
    local_7c0 = vmulps_avx512vl(auVar130,auVar130);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    _local_7e0 = vmulps_avx512vl(auVar114,auVar116);
    auVar116 = vmulps_avx512vl(_local_7e0,auVar106);
    auVar116 = vsubps_avx512vl(local_7c0,auVar116);
    uVar75 = vcmpps_avx512vl(auVar116,auVar132,5);
    bVar67 = (byte)uVar75;
    fVar167 = (float)local_9e0._0_4_;
    fVar187 = (float)local_9e0._4_4_;
    fVar189 = fStack_9d8;
    fVar191 = fStack_9d4;
    fVar154 = fStack_9d0;
    fVar193 = fStack_9cc;
    fVar195 = fStack_9c8;
    fVar197 = fStack_9c4;
    if (bVar67 == 0) {
LAB_01afdb6d:
      auVar259 = ZEXT3264(local_880);
      auVar243 = ZEXT3264(local_a00);
      auVar269 = ZEXT3264(local_ac0);
      auVar270 = ZEXT3264(local_ae0);
      auVar271 = ZEXT3264(local_b00);
    }
    else {
      local_740._0_32_ = auVar128;
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar131 = vaddps_avx512vl(auVar114,auVar114);
      local_9c0 = vrcp14ps_avx512vl(auVar131);
      auVar107 = vfnmadd213ps_avx512vl(local_9c0,auVar131,auVar107);
      auVar132 = vfmadd132ps_avx512vl(auVar107,local_9c0,local_9c0);
      auVar107._8_4_ = 0x80000000;
      auVar107._0_8_ = 0x8000000080000000;
      auVar107._12_4_ = 0x80000000;
      auVar107._16_4_ = 0x80000000;
      auVar107._20_4_ = 0x80000000;
      auVar107._24_4_ = 0x80000000;
      auVar107._28_4_ = 0x80000000;
      local_800 = vxorps_avx512vl(auVar130,auVar107);
      auVar107 = vsubps_avx512vl(local_800,auVar116);
      local_a40 = vmulps_avx512vl(auVar107,auVar132);
      auVar116 = vsubps_avx512vl(auVar116,auVar130);
      local_820 = vmulps_avx512vl(auVar116,auVar132);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar107 = vblendmps_avx512vl(auVar116,local_a40);
      auVar133._0_4_ =
           (uint)(bVar67 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar116._0_4_;
      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar10 * auVar107._4_4_ | (uint)!bVar10 * auVar116._4_4_;
      bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar10 * auVar107._8_4_ | (uint)!bVar10 * auVar116._8_4_;
      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar10 * auVar107._12_4_ | (uint)!bVar10 * auVar116._12_4_;
      bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar10 * auVar107._16_4_ | (uint)!bVar10 * auVar116._16_4_;
      bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar10 * auVar107._20_4_ | (uint)!bVar10 * auVar116._20_4_;
      bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar10 * auVar107._24_4_ | (uint)!bVar10 * auVar116._24_4_;
      bVar10 = SUB81(uVar75 >> 7,0);
      auVar133._28_4_ = (uint)bVar10 * auVar107._28_4_ | (uint)!bVar10 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar107 = vblendmps_avx512vl(auVar116,local_820);
      auVar134._0_4_ =
           (uint)(bVar67 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar116._0_4_;
      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar10 * auVar107._4_4_ | (uint)!bVar10 * auVar116._4_4_;
      bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar10 * auVar107._8_4_ | (uint)!bVar10 * auVar116._8_4_;
      bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar10 * auVar107._12_4_ | (uint)!bVar10 * auVar116._12_4_;
      bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar10 * auVar107._16_4_ | (uint)!bVar10 * auVar116._16_4_;
      bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar10 * auVar107._20_4_ | (uint)!bVar10 * auVar116._20_4_;
      bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar10 * auVar107._24_4_ | (uint)!bVar10 * auVar116._24_4_;
      bVar10 = SUB81(uVar75 >> 7,0);
      auVar134._28_4_ = (uint)bVar10 * auVar107._28_4_ | (uint)!bVar10 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar113,auVar116);
      local_840 = vmaxps_avx512vl(local_580,auVar116);
      auVar132._8_4_ = 0x36000000;
      auVar132._0_8_ = 0x3600000036000000;
      auVar132._12_4_ = 0x36000000;
      auVar132._16_4_ = 0x36000000;
      auVar132._20_4_ = 0x36000000;
      auVar132._24_4_ = 0x36000000;
      auVar132._28_4_ = 0x36000000;
      local_860 = vmulps_avx512vl(local_840,auVar132);
      vandps_avx512vl(auVar114,auVar116);
      uVar70 = vcmpps_avx512vl(local_860,local_860,1);
      uVar75 = uVar75 & uVar70;
      bVar71 = (byte)uVar75;
      if (bVar71 != 0) {
        uVar70 = vcmpps_avx512vl(auVar106,_DAT_01faff00,2);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar106,auVar113);
        bVar72 = (byte)uVar70;
        uVar82 = (uint)(bVar72 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar72 & 1) * local_860._0_4_;
        bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
        uVar81 = (uint)bVar10 * auVar114._4_4_ | (uint)!bVar10 * local_860._4_4_;
        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
        uVar146 = (uint)bVar10 * auVar114._8_4_ | (uint)!bVar10 * local_860._8_4_;
        bVar10 = (bool)((byte)(uVar70 >> 3) & 1);
        uVar147 = (uint)bVar10 * auVar114._12_4_ | (uint)!bVar10 * local_860._12_4_;
        bVar10 = (bool)((byte)(uVar70 >> 4) & 1);
        uVar148 = (uint)bVar10 * auVar114._16_4_ | (uint)!bVar10 * local_860._16_4_;
        bVar10 = (bool)((byte)(uVar70 >> 5) & 1);
        uVar149 = (uint)bVar10 * auVar114._20_4_ | (uint)!bVar10 * local_860._20_4_;
        bVar10 = (bool)((byte)(uVar70 >> 6) & 1);
        uVar150 = (uint)bVar10 * auVar114._24_4_ | (uint)!bVar10 * local_860._24_4_;
        bVar10 = SUB81(uVar70 >> 7,0);
        uVar151 = (uint)bVar10 * auVar114._28_4_ | (uint)!bVar10 * local_860._28_4_;
        auVar133._0_4_ = (bVar71 & 1) * uVar82 | !(bool)(bVar71 & 1) * auVar133._0_4_;
        bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar133._4_4_ = bVar10 * uVar81 | !bVar10 * auVar133._4_4_;
        bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar133._8_4_ = bVar10 * uVar146 | !bVar10 * auVar133._8_4_;
        bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar133._12_4_ = bVar10 * uVar147 | !bVar10 * auVar133._12_4_;
        bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar133._16_4_ = bVar10 * uVar148 | !bVar10 * auVar133._16_4_;
        bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar133._20_4_ = bVar10 * uVar149 | !bVar10 * auVar133._20_4_;
        bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar133._24_4_ = bVar10 * uVar150 | !bVar10 * auVar133._24_4_;
        bVar10 = SUB81(uVar75 >> 7,0);
        auVar133._28_4_ = bVar10 * uVar151 | !bVar10 * auVar133._28_4_;
        auVar106 = vblendmps_avx512vl(auVar113,auVar106);
        bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar134._0_4_ =
             (uint)(bVar71 & 1) *
             ((uint)(bVar72 & 1) * auVar106._0_4_ | !(bool)(bVar72 & 1) * uVar82) |
             !(bool)(bVar71 & 1) * auVar134._0_4_;
        bVar11 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar134._4_4_ =
             (uint)bVar11 * ((uint)bVar10 * auVar106._4_4_ | !bVar10 * uVar81) |
             !bVar11 * auVar134._4_4_;
        bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar134._8_4_ =
             (uint)bVar10 * ((uint)bVar12 * auVar106._8_4_ | !bVar12 * uVar146) |
             !bVar10 * auVar134._8_4_;
        bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar134._12_4_ =
             (uint)bVar10 * ((uint)bVar13 * auVar106._12_4_ | !bVar13 * uVar147) |
             !bVar10 * auVar134._12_4_;
        bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar134._16_4_ =
             (uint)bVar10 * ((uint)bVar14 * auVar106._16_4_ | !bVar14 * uVar148) |
             !bVar10 * auVar134._16_4_;
        bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar134._20_4_ =
             (uint)bVar10 * ((uint)bVar15 * auVar106._20_4_ | !bVar15 * uVar149) |
             !bVar10 * auVar134._20_4_;
        bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar134._24_4_ =
             (uint)bVar10 * ((uint)bVar16 * auVar106._24_4_ | !bVar16 * uVar150) |
             !bVar10 * auVar134._24_4_;
        bVar10 = SUB81(uVar75 >> 7,0);
        auVar134._28_4_ =
             (uint)bVar10 * ((uint)bVar17 * auVar106._28_4_ | !bVar17 * uVar151) |
             !bVar10 * auVar134._28_4_;
        bVar67 = (~bVar71 | bVar72) & bVar67;
      }
      if ((bVar67 & 0x7f) == 0) goto LAB_01afdb6d;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar127,auVar106);
      auVar114 = vxorps_avx512vl(auVar125,auVar106);
      uVar82 = *(uint *)(ray + k * 4 + 0x200);
      auVar116 = vxorps_avx512vl(auVar126,auVar106);
      auVar88 = vsubss_avx512f(ZEXT416(uVar82),ZEXT416((uint)local_990._0_4_));
      auVar107 = vbroadcastss_avx512vl(auVar88);
      auVar107 = vminps_avx512vl(auVar107,auVar134);
      auVar66._4_4_ = fStack_59c;
      auVar66._0_4_ = local_5a0;
      auVar66._8_4_ = fStack_598;
      auVar66._12_4_ = fStack_594;
      auVar66._16_4_ = fStack_590;
      auVar66._20_4_ = fStack_58c;
      auVar66._24_4_ = fStack_588;
      auVar66._28_4_ = fStack_584;
      auVar125 = vmaxps_avx512vl(auVar66,auVar133);
      auVar120 = vmulps_avx512vl(auVar120,auVar118);
      auVar119 = vfmadd213ps_avx512vl(auVar119,auVar136,auVar120);
      auVar88 = vfmadd213ps_fma(auVar115,auVar135,auVar119);
      auVar115 = vmulps_avx512vl(local_7a0,auVar118);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_780,auVar136);
      auVar89 = vfmadd231ps_fma(auVar115,_local_760,auVar135);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar89),auVar115);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar115,auVar118,1);
      auVar119 = vxorps_avx512vl(ZEXT1632(auVar88),auVar106);
      auVar120 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
      auVar132 = ZEXT1632(auVar89);
      auVar127 = vxorps_avx512vl(auVar132,auVar106);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar126 = vfnmadd213ps_avx512vl(auVar120,auVar132,auVar135);
      auVar88 = vfmadd132ps_fma(auVar126,auVar120,auVar120);
      fVar168 = auVar88._0_4_ * auVar119._0_4_;
      fVar188 = auVar88._4_4_ * auVar119._4_4_;
      auVar126._4_4_ = fVar188;
      auVar126._0_4_ = fVar168;
      fVar190 = auVar88._8_4_ * auVar119._8_4_;
      auVar126._8_4_ = fVar190;
      fVar192 = auVar88._12_4_ * auVar119._12_4_;
      auVar126._12_4_ = fVar192;
      fVar194 = auVar119._16_4_ * 0.0;
      auVar126._16_4_ = fVar194;
      fVar196 = auVar119._20_4_ * 0.0;
      auVar126._20_4_ = fVar196;
      fVar198 = auVar119._24_4_ * 0.0;
      auVar126._24_4_ = fVar198;
      auVar126._28_4_ = auVar119._28_4_;
      uVar27 = vcmpps_avx512vl(auVar132,auVar127,1);
      bVar71 = (byte)uVar26 | (byte)uVar27;
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar126 = vblendmps_avx512vl(auVar126,auVar136);
      auVar137._0_4_ =
           (uint)(bVar71 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar120._0_4_;
      bVar10 = (bool)(bVar71 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar10 * auVar126._4_4_ | (uint)!bVar10 * auVar120._4_4_;
      bVar10 = (bool)(bVar71 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar10 * auVar126._8_4_ | (uint)!bVar10 * auVar120._8_4_;
      bVar10 = (bool)(bVar71 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar10 * auVar126._12_4_ | (uint)!bVar10 * auVar120._12_4_;
      bVar10 = (bool)(bVar71 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar10 * auVar126._16_4_ | (uint)!bVar10 * auVar120._16_4_;
      bVar10 = (bool)(bVar71 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar10 * auVar126._20_4_ | (uint)!bVar10 * auVar120._20_4_;
      bVar10 = (bool)(bVar71 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar10 * auVar126._24_4_ | (uint)!bVar10 * auVar120._24_4_;
      auVar137._28_4_ =
           (uint)(bVar71 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar120._28_4_;
      auVar120 = vmaxps_avx512vl(auVar125,auVar137);
      uVar27 = vcmpps_avx512vl(auVar132,auVar127,6);
      bVar71 = (byte)uVar26 | (byte)uVar27;
      auVar138._0_4_ = (uint)(bVar71 & 1) * 0x7f800000 | (uint)!(bool)(bVar71 & 1) * (int)fVar168;
      bVar10 = (bool)(bVar71 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar188;
      bVar10 = (bool)(bVar71 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar190;
      bVar10 = (bool)(bVar71 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar192;
      bVar10 = (bool)(bVar71 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar194;
      bVar10 = (bool)(bVar71 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar196;
      bVar10 = (bool)(bVar71 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar198;
      auVar138._28_4_ =
           (uint)(bVar71 >> 7) * 0x7f800000 | (uint)!(bool)(bVar71 >> 7) * auVar119._28_4_;
      auVar119 = vminps_avx512vl(auVar107,auVar138);
      auVar88 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar88),auVar122);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar88),auVar123);
      auVar125 = ZEXT1632(auVar88);
      auVar124 = vsubps_avx512vl(auVar125,auVar124);
      auVar124 = vmulps_avx512vl(auVar124,auVar113);
      auVar123 = vfmadd231ps_avx512vl(auVar124,auVar116,auVar123);
      auVar122 = vfmadd231ps_avx512vl(auVar123,auVar114,auVar122);
      auVar113 = vmulps_avx512vl(local_7a0,auVar113);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_780,auVar116);
      auVar113 = vfmadd231ps_avx512vl(auVar113,_local_760,auVar114);
      vandps_avx512vl(auVar113,auVar115);
      uVar26 = vcmpps_avx512vl(auVar113,auVar118,1);
      auVar114 = vxorps_avx512vl(auVar122,auVar106);
      auVar115 = vrcp14ps_avx512vl(auVar113);
      auVar106 = vxorps_avx512vl(auVar113,auVar106);
      auVar116 = vfnmadd213ps_avx512vl(auVar115,auVar113,auVar135);
      auVar88 = vfmadd132ps_fma(auVar116,auVar115,auVar115);
      fVar168 = auVar88._0_4_ * auVar114._0_4_;
      fVar188 = auVar88._4_4_ * auVar114._4_4_;
      auVar127._4_4_ = fVar188;
      auVar127._0_4_ = fVar168;
      fVar190 = auVar88._8_4_ * auVar114._8_4_;
      auVar127._8_4_ = fVar190;
      fVar192 = auVar88._12_4_ * auVar114._12_4_;
      auVar127._12_4_ = fVar192;
      fVar194 = auVar114._16_4_ * 0.0;
      auVar127._16_4_ = fVar194;
      fVar196 = auVar114._20_4_ * 0.0;
      auVar127._20_4_ = fVar196;
      fVar198 = auVar114._24_4_ * 0.0;
      auVar127._24_4_ = fVar198;
      auVar127._28_4_ = auVar114._28_4_;
      uVar27 = vcmpps_avx512vl(auVar113,auVar106,1);
      bVar71 = (byte)uVar26 | (byte)uVar27;
      auVar116 = vblendmps_avx512vl(auVar127,auVar136);
      auVar139._0_4_ =
           (uint)(bVar71 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar115._0_4_;
      bVar10 = (bool)(bVar71 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar10 * auVar116._4_4_ | (uint)!bVar10 * auVar115._4_4_;
      bVar10 = (bool)(bVar71 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar10 * auVar116._8_4_ | (uint)!bVar10 * auVar115._8_4_;
      bVar10 = (bool)(bVar71 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar10 * auVar116._12_4_ | (uint)!bVar10 * auVar115._12_4_;
      bVar10 = (bool)(bVar71 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar10 * auVar116._16_4_ | (uint)!bVar10 * auVar115._16_4_;
      bVar10 = (bool)(bVar71 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar10 * auVar116._20_4_ | (uint)!bVar10 * auVar115._20_4_;
      bVar10 = (bool)(bVar71 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar10 * auVar116._24_4_ | (uint)!bVar10 * auVar115._24_4_;
      auVar139._28_4_ =
           (uint)(bVar71 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar115._28_4_;
      _local_920 = vmaxps_avx(auVar120,auVar139);
      uVar27 = vcmpps_avx512vl(auVar113,auVar106,6);
      bVar71 = (byte)uVar26 | (byte)uVar27;
      auVar140._0_4_ = (uint)(bVar71 & 1) * 0x7f800000 | (uint)!(bool)(bVar71 & 1) * (int)fVar168;
      bVar10 = (bool)(bVar71 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar188;
      bVar10 = (bool)(bVar71 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar190;
      bVar10 = (bool)(bVar71 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar192;
      bVar10 = (bool)(bVar71 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar194;
      bVar10 = (bool)(bVar71 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar196;
      bVar10 = (bool)(bVar71 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar198;
      auVar140._28_4_ =
           (uint)(bVar71 >> 7) * 0x7f800000 | (uint)!(bool)(bVar71 >> 7) * auVar114._28_4_;
      local_600 = vminps_avx(auVar119,auVar140);
      uVar26 = vcmpps_avx512vl(_local_920,local_600,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar26;
      if (bVar67 == 0) {
        auVar272 = ZEXT3264(local_a60);
        goto LAB_01afdb6d;
      }
      auVar113 = vmaxps_avx512vl(auVar125,local_aa0);
      auVar106 = vfmadd213ps_avx512vl(local_a40,auVar129,auVar109);
      fVar168 = auVar108._0_4_;
      fVar188 = auVar108._4_4_;
      auVar44._4_4_ = fVar188 * auVar106._4_4_;
      auVar44._0_4_ = fVar168 * auVar106._0_4_;
      fVar190 = auVar108._8_4_;
      auVar44._8_4_ = fVar190 * auVar106._8_4_;
      fVar192 = auVar108._12_4_;
      auVar44._12_4_ = fVar192 * auVar106._12_4_;
      fVar194 = auVar108._16_4_;
      auVar44._16_4_ = fVar194 * auVar106._16_4_;
      fVar196 = auVar108._20_4_;
      auVar44._20_4_ = fVar196 * auVar106._20_4_;
      fVar198 = auVar108._24_4_;
      auVar44._24_4_ = fVar198 * auVar106._24_4_;
      auVar44._28_4_ = auVar106._28_4_;
      auVar106 = vfmadd213ps_avx512vl(local_820,auVar129,auVar109);
      auVar45._4_4_ = fVar188 * auVar106._4_4_;
      auVar45._0_4_ = fVar168 * auVar106._0_4_;
      auVar45._8_4_ = fVar190 * auVar106._8_4_;
      auVar45._12_4_ = fVar192 * auVar106._12_4_;
      auVar45._16_4_ = fVar194 * auVar106._16_4_;
      auVar45._20_4_ = fVar196 * auVar106._20_4_;
      auVar45._24_4_ = fVar198 * auVar106._24_4_;
      auVar45._28_4_ = auVar139._28_4_;
      auVar106 = vminps_avx512vl(auVar44,auVar135);
      auVar114 = ZEXT832(0) << 0x20;
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      auVar115 = vminps_avx512vl(auVar45,auVar135);
      auVar46._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar106._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar46,auVar250,auVar235);
      local_4e0 = ZEXT1632(auVar88);
      auVar106 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
      auVar47._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar106._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar47,auVar250,auVar235);
      local_500 = ZEXT1632(auVar88);
      auVar48._4_4_ = auVar113._4_4_ * auVar113._4_4_;
      auVar48._0_4_ = auVar113._0_4_ * auVar113._0_4_;
      auVar48._8_4_ = auVar113._8_4_ * auVar113._8_4_;
      auVar48._12_4_ = auVar113._12_4_ * auVar113._12_4_;
      auVar48._16_4_ = auVar113._16_4_ * auVar113._16_4_;
      auVar48._20_4_ = auVar113._20_4_ * auVar113._20_4_;
      auVar48._24_4_ = auVar113._24_4_ * auVar113._24_4_;
      auVar48._28_4_ = auVar113._28_4_;
      auVar106 = vsubps_avx(auVar128,auVar48);
      auVar128._4_4_ = auVar106._4_4_ * (float)local_7e0._4_4_;
      auVar128._0_4_ = auVar106._0_4_ * (float)local_7e0._0_4_;
      auVar128._8_4_ = auVar106._8_4_ * fStack_7d8;
      auVar128._12_4_ = auVar106._12_4_ * fStack_7d4;
      auVar128._16_4_ = auVar106._16_4_ * fStack_7d0;
      auVar128._20_4_ = auVar106._20_4_ * fStack_7cc;
      auVar128._24_4_ = auVar106._24_4_ * fStack_7c8;
      auVar128._28_4_ = auVar113._28_4_;
      auVar113 = vsubps_avx(local_7c0,auVar128);
      uVar26 = vcmpps_avx512vl(auVar113,ZEXT832(0) << 0x20,5);
      bVar71 = (byte)uVar26;
      auVar272 = ZEXT3264(local_a60);
      auVar271 = ZEXT3264(local_b00);
      if (bVar71 == 0) {
        bVar71 = 0;
        auVar108 = ZEXT832(0) << 0x20;
        auVar166 = ZEXT864(0) << 0x20;
        auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar264 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar89 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
        uVar75 = vcmpps_avx512vl(auVar113,auVar125,5);
        auVar113 = vsqrtps_avx(auVar113);
        auVar114 = vfnmadd213ps_avx512vl(auVar131,local_9c0,auVar135);
        auVar116 = vfmadd132ps_avx512vl(auVar114,local_9c0,local_9c0);
        auVar114 = vsubps_avx(local_800,auVar113);
        auVar122 = vmulps_avx512vl(auVar114,auVar116);
        auVar113 = vsubps_avx512vl(auVar113,auVar130);
        auVar116 = vmulps_avx512vl(auVar113,auVar116);
        auVar113 = vfmadd213ps_avx512vl(auVar129,auVar122,auVar109);
        auVar131._4_4_ = fVar188 * auVar113._4_4_;
        auVar131._0_4_ = fVar168 * auVar113._0_4_;
        auVar131._8_4_ = fVar190 * auVar113._8_4_;
        auVar131._12_4_ = fVar192 * auVar113._12_4_;
        auVar131._16_4_ = fVar194 * auVar113._16_4_;
        auVar131._20_4_ = fVar196 * auVar113._20_4_;
        auVar131._24_4_ = fVar198 * auVar113._24_4_;
        auVar131._28_4_ = auVar115._28_4_;
        auVar49._4_4_ = (float)local_760._4_4_ * auVar122._4_4_;
        auVar49._0_4_ = (float)local_760._0_4_ * auVar122._0_4_;
        auVar49._8_4_ = fStack_758 * auVar122._8_4_;
        auVar49._12_4_ = fStack_754 * auVar122._12_4_;
        auVar49._16_4_ = fStack_750 * auVar122._16_4_;
        auVar49._20_4_ = fStack_74c * auVar122._20_4_;
        auVar49._24_4_ = fStack_748 * auVar122._24_4_;
        auVar49._28_4_ = auVar113._28_4_;
        auVar114 = vmulps_avx512vl(local_780,auVar122);
        auVar118 = vmulps_avx512vl(local_7a0,auVar122);
        auVar113 = vfmadd213ps_avx512vl(auVar110,auVar131,auVar242);
        auVar113 = vsubps_avx512vl(auVar49,auVar113);
        auVar115 = vfmadd213ps_avx512vl(auVar111,auVar131,auVar117);
        auVar115 = vsubps_avx512vl(auVar114,auVar115);
        auVar88 = vfmadd213ps_fma(auVar131,auVar112,auVar121);
        auVar114 = vsubps_avx(auVar118,ZEXT1632(auVar88));
        auVar264 = auVar114._0_28_;
        auVar109 = vfmadd213ps_avx512vl(auVar129,auVar116,auVar109);
        auVar109 = vmulps_avx512vl(auVar108,auVar109);
        auVar50._4_4_ = (float)local_760._4_4_ * auVar116._4_4_;
        auVar50._0_4_ = (float)local_760._0_4_ * auVar116._0_4_;
        auVar50._8_4_ = fStack_758 * auVar116._8_4_;
        auVar50._12_4_ = fStack_754 * auVar116._12_4_;
        auVar50._16_4_ = fStack_750 * auVar116._16_4_;
        auVar50._20_4_ = fStack_74c * auVar116._20_4_;
        auVar50._24_4_ = fStack_748 * auVar116._24_4_;
        auVar50._28_4_ = auVar118._28_4_;
        auVar108 = vmulps_avx512vl(local_780,auVar116);
        auVar118 = vmulps_avx512vl(local_7a0,auVar116);
        auVar88 = vfmadd213ps_fma(auVar110,auVar109,auVar242);
        auVar114 = vsubps_avx(auVar50,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar111,auVar109,auVar117);
        auVar108 = vsubps_avx512vl(auVar108,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar112,auVar109,auVar121);
        auVar110 = vsubps_avx512vl(auVar118,ZEXT1632(auVar88));
        auVar166 = ZEXT3264(auVar110);
        auVar215._8_4_ = 0x7f800000;
        auVar215._0_8_ = 0x7f8000007f800000;
        auVar215._12_4_ = 0x7f800000;
        auVar215._16_4_ = 0x7f800000;
        auVar215._20_4_ = 0x7f800000;
        auVar215._24_4_ = 0x7f800000;
        auVar215._28_4_ = 0x7f800000;
        auVar110 = vblendmps_avx512vl(auVar215,auVar122);
        bVar10 = (bool)((byte)uVar75 & 1);
        auVar129._0_4_ = (uint)bVar10 * auVar110._0_4_ | (uint)!bVar10 * auVar87._0_4_;
        bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar10 * auVar110._4_4_ | (uint)!bVar10 * auVar87._4_4_;
        bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar10 * auVar110._8_4_ | (uint)!bVar10 * auVar87._8_4_;
        bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar10 * auVar110._12_4_ | (uint)!bVar10 * auVar87._12_4_;
        iVar1 = (uint)((byte)(uVar75 >> 4) & 1) * auVar110._16_4_;
        auVar129._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar75 >> 5) & 1) * auVar110._20_4_;
        auVar129._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar75 >> 6) & 1) * auVar110._24_4_;
        auVar129._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar75 >> 7) * auVar110._28_4_;
        auVar129._28_4_ = iVar4;
        auVar216._8_4_ = 0xff800000;
        auVar216._0_8_ = 0xff800000ff800000;
        auVar216._12_4_ = 0xff800000;
        auVar216._16_4_ = 0xff800000;
        auVar216._20_4_ = 0xff800000;
        auVar216._24_4_ = 0xff800000;
        auVar216._28_4_ = 0xff800000;
        auVar110 = vblendmps_avx512vl(auVar216,auVar116);
        bVar10 = (bool)((byte)uVar75 & 1);
        auVar130._0_4_ = (uint)bVar10 * auVar110._0_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar10 * auVar110._4_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar10 * auVar110._8_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar10 * auVar110._12_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar10 * auVar110._16_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar10 * auVar110._20_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar10 * auVar110._24_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = SUB81(uVar75 >> 7,0);
        auVar130._28_4_ = (uint)bVar10 * auVar110._28_4_ | (uint)!bVar10 * -0x800000;
        auVar242._8_4_ = 0x36000000;
        auVar242._0_8_ = 0x3600000036000000;
        auVar242._12_4_ = 0x36000000;
        auVar242._16_4_ = 0x36000000;
        auVar242._20_4_ = 0x36000000;
        auVar242._24_4_ = 0x36000000;
        auVar242._28_4_ = 0x36000000;
        auVar110 = vmulps_avx512vl(local_840,auVar242);
        uVar70 = vcmpps_avx512vl(auVar110,local_860,0xe);
        uVar75 = uVar75 & uVar70;
        bVar72 = (byte)uVar75;
        if (bVar72 != 0) {
          uVar70 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar89),2);
          auVar263._8_4_ = 0x7f800000;
          auVar263._0_8_ = 0x7f8000007f800000;
          auVar263._12_4_ = 0x7f800000;
          auVar263._16_4_ = 0x7f800000;
          auVar263._20_4_ = 0x7f800000;
          auVar263._24_4_ = 0x7f800000;
          auVar263._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar106 = vblendmps_avx512vl(auVar263,auVar265);
          bVar78 = (byte)uVar70;
          uVar81 = (uint)(bVar78 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar110._0_4_;
          bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
          uVar146 = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * auVar110._4_4_;
          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
          uVar147 = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * auVar110._8_4_;
          bVar10 = (bool)((byte)(uVar70 >> 3) & 1);
          uVar148 = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * auVar110._12_4_;
          bVar10 = (bool)((byte)(uVar70 >> 4) & 1);
          uVar149 = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * auVar110._16_4_;
          bVar10 = (bool)((byte)(uVar70 >> 5) & 1);
          uVar150 = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * auVar110._20_4_;
          bVar10 = (bool)((byte)(uVar70 >> 6) & 1);
          uVar151 = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * auVar110._24_4_;
          bVar10 = SUB81(uVar70 >> 7,0);
          uVar152 = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * auVar110._28_4_;
          auVar129._0_4_ = (bVar72 & 1) * uVar81 | !(bool)(bVar72 & 1) * auVar129._0_4_;
          bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar129._4_4_ = bVar10 * uVar146 | !bVar10 * auVar129._4_4_;
          bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar129._8_4_ = bVar10 * uVar147 | !bVar10 * auVar129._8_4_;
          bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar129._12_4_ = bVar10 * uVar148 | !bVar10 * auVar129._12_4_;
          bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar129._16_4_ = bVar10 * uVar149 | (uint)!bVar10 * iVar1;
          bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar129._20_4_ = bVar10 * uVar150 | (uint)!bVar10 * iVar2;
          bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar129._24_4_ = bVar10 * uVar151 | (uint)!bVar10 * iVar3;
          bVar10 = SUB81(uVar75 >> 7,0);
          auVar129._28_4_ = bVar10 * uVar152 | (uint)!bVar10 * iVar4;
          auVar106 = vblendmps_avx512vl(auVar265,auVar263);
          bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
          bVar17 = SUB81(uVar70 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar72 & 1) *
               ((uint)(bVar78 & 1) * auVar106._0_4_ | !(bool)(bVar78 & 1) * uVar81) |
               !(bool)(bVar72 & 1) * auVar130._0_4_;
          bVar11 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar11 * ((uint)bVar10 * auVar106._4_4_ | !bVar10 * uVar146) |
               !bVar11 * auVar130._4_4_;
          bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar10 * ((uint)bVar12 * auVar106._8_4_ | !bVar12 * uVar147) |
               !bVar10 * auVar130._8_4_;
          bVar10 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar10 * ((uint)bVar13 * auVar106._12_4_ | !bVar13 * uVar148) |
               !bVar10 * auVar130._12_4_;
          bVar10 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar10 * ((uint)bVar14 * auVar106._16_4_ | !bVar14 * uVar149) |
               !bVar10 * auVar130._16_4_;
          bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar10 * ((uint)bVar15 * auVar106._20_4_ | !bVar15 * uVar150) |
               !bVar10 * auVar130._20_4_;
          bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar10 * ((uint)bVar16 * auVar106._24_4_ | !bVar16 * uVar151) |
               !bVar10 * auVar130._24_4_;
          bVar10 = SUB81(uVar75 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar10 * ((uint)bVar17 * auVar106._28_4_ | !bVar17 * uVar152) |
               !bVar10 * auVar130._28_4_;
          bVar71 = (~bVar72 | bVar78) & bVar71;
        }
      }
      auVar243._0_4_ = local_7a0._0_4_ * auVar166._0_4_;
      auVar243._4_4_ = local_7a0._4_4_ * auVar166._4_4_;
      auVar243._8_4_ = local_7a0._8_4_ * auVar166._8_4_;
      auVar243._12_4_ = local_7a0._12_4_ * auVar166._12_4_;
      auVar243._16_4_ = local_7a0._16_4_ * auVar166._16_4_;
      auVar243._20_4_ = local_7a0._20_4_ * auVar166._20_4_;
      auVar243._28_36_ = auVar166._28_36_;
      auVar243._24_4_ = local_7a0._24_4_ * auVar166._24_4_;
      auVar88 = vfmadd231ps_fma(auVar243._0_32_,local_780,auVar108);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),_local_760,auVar114);
      _local_540 = _local_920;
      local_520 = vminps_avx(local_600,auVar129);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
      auVar258._16_4_ = 0x7fffffff;
      auVar258._20_4_ = 0x7fffffff;
      auVar258._24_4_ = 0x7fffffff;
      auVar258._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(ZEXT1632(auVar88),auVar258);
      auVar108 = vmaxps_avx(_local_920,auVar130);
      auVar218._8_4_ = 0x3e99999a;
      auVar218._0_8_ = 0x3e99999a3e99999a;
      auVar218._12_4_ = 0x3e99999a;
      auVar218._16_4_ = 0x3e99999a;
      auVar218._20_4_ = 0x3e99999a;
      auVar218._24_4_ = 0x3e99999a;
      auVar218._28_4_ = 0x3e99999a;
      uVar26 = vcmpps_avx512vl(auVar106,auVar218,1);
      local_6a0._0_2_ = (short)uVar26;
      uVar26 = vcmpps_avx512vl(_local_920,local_520,2);
      bVar72 = (byte)uVar26 & bVar67;
      uVar27 = vcmpps_avx512vl(auVar108,local_600,2);
      auVar269 = ZEXT3264(local_ac0);
      auVar270 = ZEXT3264(local_ae0);
      if ((bVar67 & ((byte)uVar27 | (byte)uVar26)) == 0) {
        auVar259 = ZEXT3264(local_880);
        auVar243 = ZEXT3264(local_a00);
      }
      else {
        auVar51._4_4_ = local_7a0._4_4_ * auVar264._4_4_;
        auVar51._0_4_ = local_7a0._0_4_ * auVar264._0_4_;
        auVar51._8_4_ = local_7a0._8_4_ * auVar264._8_4_;
        auVar51._12_4_ = local_7a0._12_4_ * auVar264._12_4_;
        auVar51._16_4_ = local_7a0._16_4_ * auVar264._16_4_;
        auVar51._20_4_ = local_7a0._20_4_ * auVar264._20_4_;
        auVar51._24_4_ = local_7a0._24_4_ * auVar264._24_4_;
        auVar51._28_4_ = 0x3e99999a;
        auVar88 = vfmadd213ps_fma(auVar115,local_780,auVar51);
        auVar88 = vfmadd213ps_fma(auVar113,_local_760,ZEXT1632(auVar88));
        auVar106 = vandps_avx(ZEXT1632(auVar88),auVar258);
        uVar26 = vcmpps_avx512vl(auVar106,auVar218,1);
        bVar78 = (byte)uVar26 | ~bVar71;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar162,auVar41);
        local_5c0._0_4_ = (uint)(bVar78 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
        bVar10 = (bool)(bVar78 >> 1 & 1);
        local_5c0._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar78 >> 2 & 1);
        local_5c0._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar78 >> 3 & 1);
        local_5c0._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar78 >> 4 & 1);
        local_5c0._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar78 >> 5 & 1);
        local_5c0._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar78 >> 6 & 1);
        local_5c0._24_4_ = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 2;
        local_5c0._28_4_ = (uint)(bVar78 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
        local_640 = vpbroadcastd_avx512vl();
        uVar26 = vpcmpd_avx512vl(local_640,local_5c0,5);
        bVar78 = (byte)uVar26 & bVar72;
        local_620 = auVar108;
        if (bVar78 == 0) {
          auVar164._4_4_ = uVar82;
          auVar164._0_4_ = uVar82;
          auVar164._8_4_ = uVar82;
          auVar164._12_4_ = uVar82;
          auVar164._16_4_ = uVar82;
          auVar164._20_4_ = uVar82;
          auVar164._24_4_ = uVar82;
          auVar164._28_4_ = uVar82;
        }
        else {
          local_5e0 = auVar108;
          auVar89 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar88 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar86 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar94 = vminps_avx(auVar89,auVar86);
          auVar89 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar86 = vmaxps_avx(auVar88,auVar89);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar94,auVar201);
          auVar89 = vandps_avx(auVar86,auVar201);
          auVar88 = vmaxps_avx(auVar88,auVar89);
          auVar89 = vmovshdup_avx(auVar88);
          auVar89 = vmaxss_avx(auVar89,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar89);
          fVar167 = auVar88._0_4_ * 1.9073486e-06;
          local_980 = vshufps_avx(auVar86,auVar86,0xff);
          local_680 = (float)local_9e0._0_4_ + (float)local_920._0_4_;
          fStack_67c = (float)local_9e0._4_4_ + (float)local_920._4_4_;
          fStack_678 = fStack_9d8 + fStack_918;
          fStack_674 = fStack_9d4 + fStack_914;
          fStack_670 = fStack_9d0 + fStack_910;
          fStack_66c = fStack_9cc + fStack_90c;
          fStack_668 = fStack_9c8 + fStack_908;
          fStack_664 = fStack_9c4 + fStack_904;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar163,_local_920);
            auVar142._0_4_ =
                 (uint)(bVar78 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar78 >> 1 & 1);
            auVar142._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar78 >> 2 & 1);
            auVar142._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar78 >> 3 & 1);
            auVar142._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar78 >> 4 & 1);
            auVar142._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar78 >> 5 & 1);
            auVar142._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
            auVar142._24_4_ =
                 (uint)(bVar78 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar142,auVar142,0xb1);
            auVar106 = vminps_avx(auVar142,auVar106);
            auVar108 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar108);
            auVar108 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar108);
            uVar26 = vcmpps_avx512vl(auVar142,auVar106,0);
            bVar68 = (byte)uVar26 & bVar78;
            bVar69 = bVar78;
            if (bVar68 != 0) {
              bVar69 = bVar68;
            }
            iVar2 = 0;
            for (uVar82 = (uint)bVar69; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar82 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar187 = auVar83._0_4_;
            auVar88 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_aa0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              fVar187 = sqrtf((float)local_a20._0_4_);
              auVar88 = local_aa0._0_16_;
            }
            auVar88 = vinsertps_avx(auVar88,ZEXT416(uVar82),0x10);
            auVar166 = ZEXT1664(auVar88);
            lVar77 = 5;
            do {
              uVar169 = auVar166._0_4_;
              auVar156._4_4_ = uVar169;
              auVar156._0_4_ = uVar169;
              auVar156._8_4_ = uVar169;
              auVar156._12_4_ = uVar169;
              auVar89 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_a10);
              auVar86 = auVar166._0_16_;
              auVar88 = vmovshdup_avx(auVar86);
              local_800._0_16_ = auVar88;
              fVar195 = 1.0 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar86,auVar86,0x55);
              fVar189 = auVar88._0_4_;
              auVar202._0_4_ = local_8e0._0_4_ * fVar189;
              fVar191 = auVar88._4_4_;
              auVar202._4_4_ = local_8e0._4_4_ * fVar191;
              fVar154 = auVar88._8_4_;
              auVar202._8_4_ = local_8e0._8_4_ * fVar154;
              fVar193 = auVar88._12_4_;
              auVar202._12_4_ = local_8e0._12_4_ * fVar193;
              _local_7e0 = ZEXT416((uint)fVar195);
              auVar223._4_4_ = fVar195;
              auVar223._0_4_ = fVar195;
              auVar223._8_4_ = fVar195;
              auVar223._12_4_ = fVar195;
              auVar88 = vfmadd231ps_fma(auVar202,auVar223,local_8a0._0_16_);
              auVar238._0_4_ = local_8c0._0_4_ * fVar189;
              auVar238._4_4_ = local_8c0._4_4_ * fVar191;
              auVar238._8_4_ = local_8c0._8_4_ * fVar154;
              auVar238._12_4_ = local_8c0._12_4_ * fVar193;
              auVar86 = vfmadd231ps_fma(auVar238,auVar223,local_8e0._0_16_);
              auVar246._0_4_ = fVar189 * (float)local_900._0_4_;
              auVar246._4_4_ = fVar191 * (float)local_900._4_4_;
              auVar246._8_4_ = fVar154 * fStack_8f8;
              auVar246._12_4_ = fVar193 * fStack_8f4;
              auVar94 = vfmadd231ps_fma(auVar246,auVar223,local_8c0._0_16_);
              auVar256._0_4_ = fVar189 * auVar86._0_4_;
              auVar256._4_4_ = fVar191 * auVar86._4_4_;
              auVar256._8_4_ = fVar154 * auVar86._8_4_;
              auVar256._12_4_ = fVar193 * auVar86._12_4_;
              auVar88 = vfmadd231ps_fma(auVar256,auVar223,auVar88);
              auVar203._0_4_ = fVar189 * auVar94._0_4_;
              auVar203._4_4_ = fVar191 * auVar94._4_4_;
              auVar203._8_4_ = fVar154 * auVar94._8_4_;
              auVar203._12_4_ = fVar193 * auVar94._12_4_;
              auVar86 = vfmadd231ps_fma(auVar203,auVar223,auVar86);
              auVar239._0_4_ = fVar189 * auVar86._0_4_;
              auVar239._4_4_ = fVar191 * auVar86._4_4_;
              auVar239._8_4_ = fVar154 * auVar86._8_4_;
              auVar239._12_4_ = fVar193 * auVar86._12_4_;
              auVar94 = vfmadd231ps_fma(auVar239,auVar88,auVar223);
              auVar88 = vsubps_avx(auVar86,auVar88);
              auVar30._8_4_ = 0x40400000;
              auVar30._0_8_ = 0x4040000040400000;
              auVar30._12_4_ = 0x40400000;
              auVar86 = vmulps_avx512vl(auVar88,auVar30);
              local_7c0._0_16_ = auVar94;
              auVar89 = vsubps_avx(auVar89,auVar94);
              auVar88 = vdpps_avx(auVar89,auVar89,0x7f);
              local_aa0._0_16_ = auVar88;
              local_740 = auVar166;
              if (auVar88._0_4_ < 0.0) {
                auVar259._0_4_ = sqrtf(auVar88._0_4_);
                auVar259._4_60_ = extraout_var;
                auVar88 = auVar259._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
              }
              local_820._0_16_ = vdpps_avx(auVar86,auVar86,0x7f);
              fVar189 = local_820._0_4_;
              auVar204._4_12_ = ZEXT812(0) << 0x20;
              auVar204._0_4_ = fVar189;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              fVar191 = local_a40._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(local_820._0_16_,auVar31);
              auVar94 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,ZEXT416(0x40000000));
              local_860._0_4_ = auVar94._0_4_;
              local_9c0._0_4_ = auVar88._0_4_;
              if (fVar189 < auVar90._0_4_) {
                fVar154 = sqrtf(fVar189);
                auVar88 = ZEXT416((uint)local_9c0._0_4_);
              }
              else {
                auVar94 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar154 = auVar94._0_4_;
              }
              fVar193 = local_a40._0_4_;
              fVar189 = fVar191 * 1.5 + fVar189 * -0.5 * fVar193 * fVar193 * fVar193;
              auVar157._0_4_ = auVar86._0_4_ * fVar189;
              auVar157._4_4_ = auVar86._4_4_ * fVar189;
              auVar157._8_4_ = auVar86._8_4_ * fVar189;
              auVar157._12_4_ = auVar86._12_4_ * fVar189;
              local_a40._0_16_ = vdpps_avx(auVar89,auVar157,0x7f);
              auVar87 = vaddss_avx512f(auVar88,ZEXT416(0x3f800000));
              auVar158._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar158._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar158._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar158._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar94 = vsubps_avx(local_aa0._0_16_,auVar158);
              fVar191 = auVar94._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar191;
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar91 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
              auVar92 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
              uVar80 = fVar191 == 0.0;
              uVar79 = fVar191 < 0.0;
              if ((bool)uVar79) {
                local_940._0_4_ = fVar154;
                local_960._0_4_ = auVar91._0_4_;
                local_970._4_4_ = fVar189;
                local_970._0_4_ = fVar189;
                fStack_968 = fVar189;
                fStack_964 = fVar189;
                local_950 = auVar90;
                fVar191 = sqrtf(fVar191);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar91 = ZEXT416((uint)local_960._0_4_);
                auVar88 = ZEXT416((uint)local_9c0._0_4_);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar90 = local_950;
                fVar189 = (float)local_970._0_4_;
                fVar193 = (float)local_970._4_4_;
                fVar195 = fStack_968;
                fVar197 = fStack_964;
                fVar154 = (float)local_940._0_4_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar191 = auVar94._0_4_;
                fVar193 = fVar189;
                fVar195 = fVar189;
                fVar197 = fVar189;
              }
              auVar272 = ZEXT3264(local_a60);
              auVar269 = ZEXT3264(local_ac0);
              auVar270 = ZEXT3264(local_ae0);
              auVar271 = ZEXT3264(local_b00);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7e0,local_800._0_16_);
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_800._0_16_,_local_7e0);
              fVar168 = auVar94._0_4_ * 6.0;
              fVar188 = local_800._0_4_ * 6.0;
              auVar224._0_4_ = fVar188 * (float)local_900._0_4_;
              auVar224._4_4_ = fVar188 * (float)local_900._4_4_;
              auVar224._8_4_ = fVar188 * fStack_8f8;
              auVar224._12_4_ = fVar188 * fStack_8f4;
              auVar205._4_4_ = fVar168;
              auVar205._0_4_ = fVar168;
              auVar205._8_4_ = fVar168;
              auVar205._12_4_ = fVar168;
              auVar94 = vfmadd132ps_fma(auVar205,auVar224,local_8c0._0_16_);
              fVar168 = auVar84._0_4_ * 6.0;
              auVar174._4_4_ = fVar168;
              auVar174._0_4_ = fVar168;
              auVar174._8_4_ = fVar168;
              auVar174._12_4_ = fVar168;
              auVar94 = vfmadd132ps_fma(auVar174,auVar94,local_8e0._0_16_);
              fVar168 = local_7e0._0_4_ * 6.0;
              auVar206._4_4_ = fVar168;
              auVar206._0_4_ = fVar168;
              auVar206._8_4_ = fVar168;
              auVar206._12_4_ = fVar168;
              auVar94 = vfmadd132ps_fma(auVar206,auVar94,local_8a0._0_16_);
              auVar175._0_4_ = auVar94._0_4_ * (float)local_820._0_4_;
              auVar175._4_4_ = auVar94._4_4_ * (float)local_820._0_4_;
              auVar175._8_4_ = auVar94._8_4_ * (float)local_820._0_4_;
              auVar175._12_4_ = auVar94._12_4_ * (float)local_820._0_4_;
              auVar94 = vdpps_avx(auVar86,auVar94,0x7f);
              fVar168 = auVar94._0_4_;
              auVar207._0_4_ = auVar86._0_4_ * fVar168;
              auVar207._4_4_ = auVar86._4_4_ * fVar168;
              auVar207._8_4_ = auVar86._8_4_ * fVar168;
              auVar207._12_4_ = auVar86._12_4_ * fVar168;
              auVar94 = vsubps_avx(auVar175,auVar207);
              fVar168 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar167),
                                   ZEXT416((uint)(local_740._0_4_ * fVar187 * 1.9073486e-06)));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(auVar86,auVar32);
              auVar176._0_4_ = fVar189 * auVar94._0_4_ * fVar168;
              auVar176._4_4_ = fVar193 * auVar94._4_4_ * fVar168;
              auVar176._8_4_ = fVar195 * auVar94._8_4_ * fVar168;
              auVar176._12_4_ = fVar197 * auVar94._12_4_ * fVar168;
              auVar94 = vdpps_avx(auVar93,auVar157,0x7f);
              auVar95 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar167),auVar84);
              auVar88 = vdpps_avx(auVar89,auVar176,0x7f);
              vfmadd213ss_avx512f(auVar87,ZEXT416((uint)(fVar167 / fVar154)),auVar95);
              fVar189 = auVar94._0_4_ + auVar88._0_4_;
              auVar88 = vdpps_avx(local_a10,auVar157,0x7f);
              auVar94 = vdpps_avx(auVar89,auVar93,0x7f);
              auVar87 = vmulss_avx512f(auVar92,auVar90);
              auVar90 = vmulss_avx512f(auVar90,auVar90);
              auVar91 = vaddss_avx512f(auVar91,ZEXT416((uint)(auVar87._0_4_ * auVar90._0_4_)));
              auVar90 = vdpps_avx(auVar89,local_a10,0x7f);
              auVar92 = vfnmadd231ss_avx512f(auVar94,local_a40._0_16_,ZEXT416((uint)fVar189));
              auVar90 = vfnmadd231ss_avx512f(auVar90,local_a40._0_16_,auVar88);
              auVar94 = vpermilps_avx(local_7c0._0_16_,0xff);
              fVar191 = fVar191 - auVar94._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0xff);
              auVar94 = vfmsub213ss_fma(auVar92,auVar91,auVar87);
              auVar261._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar261._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar261._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_));
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar94._0_4_)),
                                        ZEXT416((uint)fVar189),auVar90);
              auVar94 = vinsertps_avx(auVar261,auVar90,0x1c);
              auVar247._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar247._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar247._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar189),auVar247,0x10);
              auVar225._0_4_ = auVar91._0_4_;
              auVar225._4_4_ = auVar225._0_4_;
              auVar225._8_4_ = auVar225._0_4_;
              auVar225._12_4_ = auVar225._0_4_;
              auVar88 = vdivps_avx(auVar94,auVar225);
              auVar94 = vdivps_avx(auVar90,auVar225);
              auVar90 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar226._0_4_ = auVar90._0_4_ * auVar88._0_4_ + fVar191 * auVar94._0_4_;
              auVar226._4_4_ = auVar90._4_4_ * auVar88._4_4_ + fVar191 * auVar94._4_4_;
              auVar226._8_4_ = auVar90._8_4_ * auVar88._8_4_ + fVar191 * auVar94._8_4_;
              auVar226._12_4_ = auVar90._12_4_ * auVar88._12_4_ + fVar191 * auVar94._12_4_;
              auVar88 = vsubps_avx(local_740._0_16_,auVar226);
              auVar166 = ZEXT1664(auVar88);
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx512vl(local_a40._0_16_,auVar33);
              auVar94 = vucomiss_avx512f(auVar94);
              if (!(bool)uVar79 && !(bool)uVar80) {
                auVar94 = vaddss_avx512f(auVar84,auVar94);
                auVar94 = vfmadd231ss_fma(auVar94,local_980,ZEXT416(0x36000000));
                auVar34._8_4_ = 0x7fffffff;
                auVar34._0_8_ = 0x7fffffff7fffffff;
                auVar34._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx512vl(ZEXT416((uint)fVar191),auVar34);
                if (auVar90._0_4_ < auVar94._0_4_) {
                  fVar187 = auVar88._0_4_ + (float)local_990._0_4_;
                  if ((fVar187 < fVar153) ||
                     (fVar189 = *(float *)(ray + k * 4 + 0x200), fVar189 < fVar187)) break;
                  auVar88 = vmovshdup_avx(auVar88);
                  fVar191 = auVar88._0_4_;
                  if ((fVar191 < 0.0) || (1.0 < fVar191)) break;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_aa0._0_4_));
                  fVar154 = auVar88._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar76].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar154 = fVar154 * 1.5 +
                            (float)local_aa0._0_4_ * -0.5 * fVar154 * fVar154 * fVar154;
                  auVar227._0_4_ = auVar89._0_4_ * fVar154;
                  auVar227._4_4_ = auVar89._4_4_ * fVar154;
                  auVar227._8_4_ = auVar89._8_4_ * fVar154;
                  auVar227._12_4_ = auVar89._12_4_ * fVar154;
                  auVar94 = vfmadd213ps_fma(auVar87,auVar227,auVar86);
                  auVar88 = vshufps_avx(auVar227,auVar227,0xc9);
                  auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar228._0_4_ = auVar227._0_4_ * auVar89._0_4_;
                  auVar228._4_4_ = auVar227._4_4_ * auVar89._4_4_;
                  auVar228._8_4_ = auVar227._8_4_ * auVar89._8_4_;
                  auVar228._12_4_ = auVar227._12_4_ * auVar89._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar228,auVar86,auVar88);
                  auVar88 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar89 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar177._0_4_ = auVar94._0_4_ * auVar86._0_4_;
                  auVar177._4_4_ = auVar94._4_4_ * auVar86._4_4_;
                  auVar177._8_4_ = auVar94._8_4_ * auVar86._8_4_;
                  auVar177._12_4_ = auVar94._12_4_ * auVar86._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar177,auVar88,auVar89);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar187;
                    uVar169 = vextractps_avx(auVar88,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar169;
                    uVar169 = vextractps_avx(auVar88,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar169;
                    *(int *)(ray + k * 4 + 0x380) = auVar88._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar76;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar9 = context->user;
                  auVar243 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar243,auVar166);
                  auVar166 = vpermps_avx512f(auVar243,ZEXT1664(auVar88));
                  auVar243 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar243,ZEXT1664(auVar88));
                  local_380 = vbroadcastss_avx512f(auVar88);
                  local_400[0] = (RTCHitN)auVar166[0];
                  local_400[1] = (RTCHitN)auVar166[1];
                  local_400[2] = (RTCHitN)auVar166[2];
                  local_400[3] = (RTCHitN)auVar166[3];
                  local_400[4] = (RTCHitN)auVar166[4];
                  local_400[5] = (RTCHitN)auVar166[5];
                  local_400[6] = (RTCHitN)auVar166[6];
                  local_400[7] = (RTCHitN)auVar166[7];
                  local_400[8] = (RTCHitN)auVar166[8];
                  local_400[9] = (RTCHitN)auVar166[9];
                  local_400[10] = (RTCHitN)auVar166[10];
                  local_400[0xb] = (RTCHitN)auVar166[0xb];
                  local_400[0xc] = (RTCHitN)auVar166[0xc];
                  local_400[0xd] = (RTCHitN)auVar166[0xd];
                  local_400[0xe] = (RTCHitN)auVar166[0xe];
                  local_400[0xf] = (RTCHitN)auVar166[0xf];
                  local_400[0x10] = (RTCHitN)auVar166[0x10];
                  local_400[0x11] = (RTCHitN)auVar166[0x11];
                  local_400[0x12] = (RTCHitN)auVar166[0x12];
                  local_400[0x13] = (RTCHitN)auVar166[0x13];
                  local_400[0x14] = (RTCHitN)auVar166[0x14];
                  local_400[0x15] = (RTCHitN)auVar166[0x15];
                  local_400[0x16] = (RTCHitN)auVar166[0x16];
                  local_400[0x17] = (RTCHitN)auVar166[0x17];
                  local_400[0x18] = (RTCHitN)auVar166[0x18];
                  local_400[0x19] = (RTCHitN)auVar166[0x19];
                  local_400[0x1a] = (RTCHitN)auVar166[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar166[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar166[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar166[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar166[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar166[0x1f];
                  local_400[0x20] = (RTCHitN)auVar166[0x20];
                  local_400[0x21] = (RTCHitN)auVar166[0x21];
                  local_400[0x22] = (RTCHitN)auVar166[0x22];
                  local_400[0x23] = (RTCHitN)auVar166[0x23];
                  local_400[0x24] = (RTCHitN)auVar166[0x24];
                  local_400[0x25] = (RTCHitN)auVar166[0x25];
                  local_400[0x26] = (RTCHitN)auVar166[0x26];
                  local_400[0x27] = (RTCHitN)auVar166[0x27];
                  local_400[0x28] = (RTCHitN)auVar166[0x28];
                  local_400[0x29] = (RTCHitN)auVar166[0x29];
                  local_400[0x2a] = (RTCHitN)auVar166[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar166[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar166[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar166[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar166[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar166[0x2f];
                  local_400[0x30] = (RTCHitN)auVar166[0x30];
                  local_400[0x31] = (RTCHitN)auVar166[0x31];
                  local_400[0x32] = (RTCHitN)auVar166[0x32];
                  local_400[0x33] = (RTCHitN)auVar166[0x33];
                  local_400[0x34] = (RTCHitN)auVar166[0x34];
                  local_400[0x35] = (RTCHitN)auVar166[0x35];
                  local_400[0x36] = (RTCHitN)auVar166[0x36];
                  local_400[0x37] = (RTCHitN)auVar166[0x37];
                  local_400[0x38] = (RTCHitN)auVar166[0x38];
                  local_400[0x39] = (RTCHitN)auVar166[0x39];
                  local_400[0x3a] = (RTCHitN)auVar166[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar166[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar166[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar166[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar166[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar166[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar166 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar166);
                  auVar106 = vpcmpeqd_avx2(auVar166._0_32_,auVar166._0_32_);
                  local_a68[3] = auVar106;
                  local_a68[2] = auVar106;
                  local_a68[1] = auVar106;
                  *local_a68 = auVar106;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar187;
                  auVar166 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar166);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar7->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_b30);
                    auVar271 = ZEXT3264(local_b00);
                    auVar270 = ZEXT3264(local_ae0);
                    auVar269 = ZEXT3264(local_ac0);
                    auVar272 = ZEXT3264(local_a60);
                    auVar166 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar166,auVar166);
                  if ((short)uVar26 != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_b30);
                      auVar271 = ZEXT3264(local_b00);
                      auVar270 = ZEXT3264(local_ae0);
                      auVar269 = ZEXT3264(local_ac0);
                      auVar272 = ZEXT3264(local_a60);
                      auVar166 = vmovdqa64_avx512f(local_700);
                    }
                    uVar75 = vptestmd_avx512f(auVar166,auVar166);
                    if ((short)uVar75 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar52 = *(int *)(local_b30.hit + 0x10);
                      iVar53 = *(int *)(local_b30.hit + 0x14);
                      iVar54 = *(int *)(local_b30.hit + 0x18);
                      iVar55 = *(int *)(local_b30.hit + 0x1c);
                      iVar56 = *(int *)(local_b30.hit + 0x20);
                      iVar57 = *(int *)(local_b30.hit + 0x24);
                      iVar58 = *(int *)(local_b30.hit + 0x28);
                      iVar59 = *(int *)(local_b30.hit + 0x2c);
                      iVar60 = *(int *)(local_b30.hit + 0x30);
                      iVar61 = *(int *)(local_b30.hit + 0x34);
                      iVar62 = *(int *)(local_b30.hit + 0x38);
                      iVar63 = *(int *)(local_b30.hit + 0x3c);
                      bVar69 = (byte)uVar75;
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar68 = (byte)(uVar75 >> 8);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar69 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar68 & 1) * iVar56 |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar52 = *(int *)(local_b30.hit + 0x50);
                      iVar53 = *(int *)(local_b30.hit + 0x54);
                      iVar54 = *(int *)(local_b30.hit + 0x58);
                      iVar55 = *(int *)(local_b30.hit + 0x5c);
                      iVar56 = *(int *)(local_b30.hit + 0x60);
                      iVar57 = *(int *)(local_b30.hit + 100);
                      iVar58 = *(int *)(local_b30.hit + 0x68);
                      iVar59 = *(int *)(local_b30.hit + 0x6c);
                      iVar60 = *(int *)(local_b30.hit + 0x70);
                      iVar61 = *(int *)(local_b30.hit + 0x74);
                      iVar62 = *(int *)(local_b30.hit + 0x78);
                      iVar63 = *(int *)(local_b30.hit + 0x7c);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar69 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar68 & 1) * iVar56 |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar52 = *(int *)(local_b30.hit + 0x90);
                      iVar53 = *(int *)(local_b30.hit + 0x94);
                      iVar54 = *(int *)(local_b30.hit + 0x98);
                      iVar55 = *(int *)(local_b30.hit + 0x9c);
                      iVar56 = *(int *)(local_b30.hit + 0xa0);
                      iVar57 = *(int *)(local_b30.hit + 0xa4);
                      iVar58 = *(int *)(local_b30.hit + 0xa8);
                      iVar59 = *(int *)(local_b30.hit + 0xac);
                      iVar60 = *(int *)(local_b30.hit + 0xb0);
                      iVar61 = *(int *)(local_b30.hit + 0xb4);
                      iVar62 = *(int *)(local_b30.hit + 0xb8);
                      iVar63 = *(int *)(local_b30.hit + 0xbc);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar69 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar68 & 1) * iVar56 |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar52 = *(int *)(local_b30.hit + 0xd0);
                      iVar53 = *(int *)(local_b30.hit + 0xd4);
                      iVar54 = *(int *)(local_b30.hit + 0xd8);
                      iVar55 = *(int *)(local_b30.hit + 0xdc);
                      iVar56 = *(int *)(local_b30.hit + 0xe0);
                      iVar57 = *(int *)(local_b30.hit + 0xe4);
                      iVar58 = *(int *)(local_b30.hit + 0xe8);
                      iVar59 = *(int *)(local_b30.hit + 0xec);
                      iVar60 = *(int *)(local_b30.hit + 0xf0);
                      iVar61 = *(int *)(local_b30.hit + 0xf4);
                      iVar62 = *(int *)(local_b30.hit + 0xf8);
                      iVar63 = *(int *)(local_b30.hit + 0xfc);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar69 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar68 & 1) * iVar56 |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar52 = *(int *)(local_b30.hit + 0x110);
                      iVar53 = *(int *)(local_b30.hit + 0x114);
                      iVar54 = *(int *)(local_b30.hit + 0x118);
                      iVar55 = *(int *)(local_b30.hit + 0x11c);
                      iVar56 = *(int *)(local_b30.hit + 0x120);
                      iVar57 = *(int *)(local_b30.hit + 0x124);
                      iVar58 = *(int *)(local_b30.hit + 0x128);
                      iVar59 = *(int *)(local_b30.hit + 300);
                      iVar60 = *(int *)(local_b30.hit + 0x130);
                      iVar61 = *(int *)(local_b30.hit + 0x134);
                      iVar62 = *(int *)(local_b30.hit + 0x138);
                      iVar63 = *(int *)(local_b30.hit + 0x13c);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar69 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar68 & 1) * iVar56 |
                           (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x43c);
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar166 = vmovdqu32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar166 = vmovdqu32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar166 = vmovdqa32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar166 = vmovdqa32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar166;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar189;
                  break;
                }
              }
              lVar77 = lVar77 + -1;
            } while (lVar77 != 0);
            uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar164._4_4_ = uVar169;
            auVar164._0_4_ = uVar169;
            auVar164._8_4_ = uVar169;
            auVar164._12_4_ = uVar169;
            auVar164._16_4_ = uVar169;
            auVar164._20_4_ = uVar169;
            auVar164._24_4_ = uVar169;
            auVar164._28_4_ = uVar169;
            auVar64._4_4_ = fStack_67c;
            auVar64._0_4_ = local_680;
            auVar64._8_4_ = fStack_678;
            auVar64._12_4_ = fStack_674;
            auVar64._16_4_ = fStack_670;
            auVar64._20_4_ = fStack_66c;
            auVar64._24_4_ = fStack_668;
            auVar64._28_4_ = fStack_664;
            uVar26 = vcmpps_avx512vl(auVar164,auVar64,0xd);
            bVar78 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar78 & (byte)uVar26;
          } while (bVar78 != 0);
          auVar108 = local_5e0;
        }
        bVar71 = local_6a0[0] | ~bVar71;
        auVar185._0_4_ = (float)local_9e0._0_4_ + auVar108._0_4_;
        auVar185._4_4_ = (float)local_9e0._4_4_ + auVar108._4_4_;
        auVar185._8_4_ = fStack_9d8 + auVar108._8_4_;
        auVar185._12_4_ = fStack_9d4 + auVar108._12_4_;
        auVar185._16_4_ = fStack_9d0 + auVar108._16_4_;
        auVar185._20_4_ = fStack_9cc + auVar108._20_4_;
        auVar185._24_4_ = fStack_9c8 + auVar108._24_4_;
        auVar185._28_4_ = fStack_9c4 + auVar108._28_4_;
        uVar26 = vcmpps_avx512vl(auVar185,auVar164,2);
        bVar67 = (byte)uVar27 & bVar67 & (byte)uVar26;
        auVar186._8_4_ = 2;
        auVar186._0_8_ = 0x200000002;
        auVar186._12_4_ = 2;
        auVar186._16_4_ = 2;
        auVar186._20_4_ = 2;
        auVar186._24_4_ = 2;
        auVar186._28_4_ = 2;
        auVar42._8_4_ = 3;
        auVar42._0_8_ = 0x300000003;
        auVar42._12_4_ = 3;
        auVar42._16_4_ = 3;
        auVar42._20_4_ = 3;
        auVar42._24_4_ = 3;
        auVar42._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar186,auVar42);
        auVar143._0_4_ = (uint)(bVar71 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar10 = (bool)(bVar71 >> 1 & 1);
        auVar143._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar71 >> 2 & 1);
        auVar143._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar71 >> 3 & 1);
        auVar143._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar71 >> 4 & 1);
        auVar143._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar71 >> 5 & 1);
        auVar143._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar71 >> 6 & 1);
        auVar143._24_4_ = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * 2;
        auVar143._28_4_ = (uint)(bVar71 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        uVar26 = vpcmpd_avx512vl(local_640,auVar143,5);
        bVar71 = (byte)uVar26 & bVar67;
        fVar167 = (float)local_9e0._0_4_;
        fVar187 = (float)local_9e0._4_4_;
        fVar189 = fStack_9d8;
        fVar191 = fStack_9d4;
        fVar154 = fStack_9d0;
        fVar193 = fStack_9cc;
        fVar195 = fStack_9c8;
        fVar197 = fStack_9c4;
        if (bVar71 != 0) {
          auVar89 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar88 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar86 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar94 = vminps_avx(auVar89,auVar86);
          auVar89 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar86 = vmaxps_avx(auVar88,auVar89);
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar94,auVar208);
          auVar89 = vandps_avx(auVar86,auVar208);
          auVar88 = vmaxps_avx(auVar88,auVar89);
          auVar89 = vmovshdup_avx(auVar88);
          auVar89 = vmaxss_avx(auVar89,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar89);
          fVar167 = auVar88._0_4_ * 1.9073486e-06;
          local_980 = vshufps_avx(auVar86,auVar86,0xff);
          local_680 = (float)local_9e0._0_4_ + local_620._0_4_;
          fStack_67c = (float)local_9e0._4_4_ + local_620._4_4_;
          fStack_678 = fStack_9d8 + local_620._8_4_;
          fStack_674 = fStack_9d4 + local_620._12_4_;
          fStack_670 = fStack_9d0 + local_620._16_4_;
          fStack_66c = fStack_9cc + local_620._20_4_;
          fStack_668 = fStack_9c8 + local_620._24_4_;
          fStack_664 = fStack_9c4 + local_620._28_4_;
          _local_920 = local_620;
          local_6a0 = auVar143;
          do {
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar165,_local_920);
            auVar144._0_4_ =
                 (uint)(bVar71 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar71 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar71 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar71 >> 3 & 1);
            auVar144._12_4_ = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar71 >> 4 & 1);
            auVar144._16_4_ = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar71 >> 5 & 1);
            auVar144._20_4_ = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * 0x7f800000;
            auVar144._24_4_ =
                 (uint)(bVar71 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar144,auVar144,0xb1);
            auVar106 = vminps_avx(auVar144,auVar106);
            auVar108 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar108);
            auVar108 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar108);
            uVar26 = vcmpps_avx512vl(auVar144,auVar106,0);
            bVar69 = (byte)uVar26 & bVar71;
            bVar78 = bVar71;
            if (bVar69 != 0) {
              bVar78 = bVar69;
            }
            iVar2 = 0;
            for (uVar82 = (uint)bVar78; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar82 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar187 = auVar85._0_4_;
            auVar88 = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_aa0._0_16_ = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
              fVar187 = sqrtf((float)local_a20._0_4_);
              auVar88 = local_aa0._0_16_;
            }
            auVar88 = vinsertps_avx(auVar88,ZEXT416(uVar82),0x10);
            auVar166 = ZEXT1664(auVar88);
            lVar77 = 5;
            do {
              uVar169 = auVar166._0_4_;
              auVar159._4_4_ = uVar169;
              auVar159._0_4_ = uVar169;
              auVar159._8_4_ = uVar169;
              auVar159._12_4_ = uVar169;
              auVar89 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_a10);
              auVar86 = auVar166._0_16_;
              auVar88 = vmovshdup_avx(auVar86);
              local_800._0_16_ = auVar88;
              fVar195 = 1.0 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar86,auVar86,0x55);
              fVar189 = auVar88._0_4_;
              auVar209._0_4_ = local_8e0._0_4_ * fVar189;
              fVar191 = auVar88._4_4_;
              auVar209._4_4_ = local_8e0._4_4_ * fVar191;
              fVar154 = auVar88._8_4_;
              auVar209._8_4_ = local_8e0._8_4_ * fVar154;
              fVar193 = auVar88._12_4_;
              auVar209._12_4_ = local_8e0._12_4_ * fVar193;
              _local_7e0 = ZEXT416((uint)fVar195);
              auVar229._4_4_ = fVar195;
              auVar229._0_4_ = fVar195;
              auVar229._8_4_ = fVar195;
              auVar229._12_4_ = fVar195;
              auVar88 = vfmadd231ps_fma(auVar209,auVar229,local_8a0._0_16_);
              auVar240._0_4_ = local_8c0._0_4_ * fVar189;
              auVar240._4_4_ = local_8c0._4_4_ * fVar191;
              auVar240._8_4_ = local_8c0._8_4_ * fVar154;
              auVar240._12_4_ = local_8c0._12_4_ * fVar193;
              auVar86 = vfmadd231ps_fma(auVar240,auVar229,local_8e0._0_16_);
              auVar248._0_4_ = fVar189 * (float)local_900._0_4_;
              auVar248._4_4_ = fVar191 * (float)local_900._4_4_;
              auVar248._8_4_ = fVar154 * fStack_8f8;
              auVar248._12_4_ = fVar193 * fStack_8f4;
              auVar94 = vfmadd231ps_fma(auVar248,auVar229,local_8c0._0_16_);
              auVar257._0_4_ = fVar189 * auVar86._0_4_;
              auVar257._4_4_ = fVar191 * auVar86._4_4_;
              auVar257._8_4_ = fVar154 * auVar86._8_4_;
              auVar257._12_4_ = fVar193 * auVar86._12_4_;
              auVar88 = vfmadd231ps_fma(auVar257,auVar229,auVar88);
              auVar210._0_4_ = fVar189 * auVar94._0_4_;
              auVar210._4_4_ = fVar191 * auVar94._4_4_;
              auVar210._8_4_ = fVar154 * auVar94._8_4_;
              auVar210._12_4_ = fVar193 * auVar94._12_4_;
              auVar86 = vfmadd231ps_fma(auVar210,auVar229,auVar86);
              auVar241._0_4_ = fVar189 * auVar86._0_4_;
              auVar241._4_4_ = fVar191 * auVar86._4_4_;
              auVar241._8_4_ = fVar154 * auVar86._8_4_;
              auVar241._12_4_ = fVar193 * auVar86._12_4_;
              auVar94 = vfmadd231ps_fma(auVar241,auVar88,auVar229);
              auVar88 = vsubps_avx(auVar86,auVar88);
              auVar35._8_4_ = 0x40400000;
              auVar35._0_8_ = 0x4040000040400000;
              auVar35._12_4_ = 0x40400000;
              auVar86 = vmulps_avx512vl(auVar88,auVar35);
              local_7c0._0_16_ = auVar94;
              auVar89 = vsubps_avx(auVar89,auVar94);
              auVar88 = vdpps_avx(auVar89,auVar89,0x7f);
              local_aa0._0_16_ = auVar88;
              local_740 = auVar166;
              if (auVar88._0_4_ < 0.0) {
                auVar269._0_4_ = sqrtf(auVar88._0_4_);
                auVar269._4_60_ = extraout_var_00;
                auVar88 = auVar269._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
              }
              local_820._0_16_ = vdpps_avx(auVar86,auVar86,0x7f);
              fVar189 = local_820._0_4_;
              auVar211._4_12_ = ZEXT812(0) << 0x20;
              auVar211._0_4_ = fVar189;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
              fVar191 = local_a40._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(local_820._0_16_,auVar36);
              auVar94 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,ZEXT416(0x40000000));
              local_860._0_4_ = auVar94._0_4_;
              local_9c0._0_4_ = auVar88._0_4_;
              if (fVar189 < auVar90._0_4_) {
                fVar154 = sqrtf(fVar189);
                auVar88 = ZEXT416((uint)local_9c0._0_4_);
              }
              else {
                auVar94 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar154 = auVar94._0_4_;
              }
              fVar193 = local_a40._0_4_;
              auVar87 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar191 * 1.5 +
                                                 fVar189 * -0.5 * fVar193 * fVar193 * fVar193)));
              auVar90 = vmulps_avx512vl(auVar86,auVar87);
              local_a40._0_16_ = vdpps_avx(auVar89,auVar90,0x7f);
              auVar92 = vaddss_avx512f(auVar88,ZEXT416(0x3f800000));
              auVar160._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar160._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar160._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar160._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar94 = vsubps_avx(local_aa0._0_16_,auVar160);
              fVar189 = auVar94._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar189;
              auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar84 = vmulss_avx512f(auVar91,ZEXT416(0x3fc00000));
              auVar95 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
              uVar80 = fVar189 == 0.0;
              uVar79 = fVar189 < 0.0;
              if ((bool)uVar79) {
                local_950._0_4_ = auVar84._0_4_;
                _local_970 = auVar87;
                local_960 = auVar90;
                local_940 = auVar91;
                fVar189 = sqrtf(fVar189);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar84 = ZEXT416((uint)local_950._0_4_);
                auVar88 = ZEXT416((uint)local_9c0._0_4_);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar90 = local_960;
                auVar91 = local_940;
                auVar87 = _local_970;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar189 = auVar94._0_4_;
              }
              auVar272 = ZEXT3264(local_a60);
              auVar269 = ZEXT3264(local_ac0);
              auVar270 = ZEXT3264(local_ae0);
              auVar271 = ZEXT3264(local_b00);
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7e0,local_800._0_16_);
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_800._0_16_,_local_7e0);
              fVar191 = auVar94._0_4_ * 6.0;
              fVar193 = local_800._0_4_ * 6.0;
              auVar230._0_4_ = fVar193 * (float)local_900._0_4_;
              auVar230._4_4_ = fVar193 * (float)local_900._4_4_;
              auVar230._8_4_ = fVar193 * fStack_8f8;
              auVar230._12_4_ = fVar193 * fStack_8f4;
              auVar212._4_4_ = fVar191;
              auVar212._0_4_ = fVar191;
              auVar212._8_4_ = fVar191;
              auVar212._12_4_ = fVar191;
              auVar94 = vfmadd132ps_fma(auVar212,auVar230,local_8c0._0_16_);
              fVar191 = auVar93._0_4_ * 6.0;
              auVar179._4_4_ = fVar191;
              auVar179._0_4_ = fVar191;
              auVar179._8_4_ = fVar191;
              auVar179._12_4_ = fVar191;
              auVar94 = vfmadd132ps_fma(auVar179,auVar94,local_8e0._0_16_);
              fVar191 = local_7e0._0_4_ * 6.0;
              auVar213._4_4_ = fVar191;
              auVar213._0_4_ = fVar191;
              auVar213._8_4_ = fVar191;
              auVar213._12_4_ = fVar191;
              auVar94 = vfmadd132ps_fma(auVar213,auVar94,local_8a0._0_16_);
              auVar180._0_4_ = auVar94._0_4_ * (float)local_820._0_4_;
              auVar180._4_4_ = auVar94._4_4_ * (float)local_820._0_4_;
              auVar180._8_4_ = auVar94._8_4_ * (float)local_820._0_4_;
              auVar180._12_4_ = auVar94._12_4_ * (float)local_820._0_4_;
              auVar94 = vdpps_avx(auVar86,auVar94,0x7f);
              fVar191 = auVar94._0_4_;
              auVar214._0_4_ = auVar86._0_4_ * fVar191;
              auVar214._4_4_ = auVar86._4_4_ * fVar191;
              auVar214._8_4_ = auVar86._8_4_ * fVar191;
              auVar214._12_4_ = auVar86._12_4_ * fVar191;
              auVar94 = vsubps_avx(auVar180,auVar214);
              fVar191 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar93 = vmaxss_avx(ZEXT416((uint)fVar167),
                                   ZEXT416((uint)(local_740._0_4_ * fVar187 * 1.9073486e-06)));
              auVar181._0_4_ = auVar94._0_4_ * fVar191;
              auVar181._4_4_ = auVar94._4_4_ * fVar191;
              auVar181._8_4_ = auVar94._8_4_ * fVar191;
              auVar181._12_4_ = auVar94._12_4_ * fVar191;
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(auVar86,auVar37);
              auVar97 = vmulps_avx512vl(auVar87,auVar181);
              auVar94 = vdpps_avx(auVar96,auVar90,0x7f);
              auVar87 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar167),auVar93);
              auVar88 = vdpps_avx(auVar89,auVar97,0x7f);
              vfmadd213ss_avx512f(auVar92,ZEXT416((uint)(fVar167 / fVar154)),auVar87);
              fVar191 = auVar94._0_4_ + auVar88._0_4_;
              auVar88 = vdpps_avx(local_a10,auVar90,0x7f);
              auVar94 = vdpps_avx(auVar89,auVar96,0x7f);
              auVar90 = vmulss_avx512f(auVar95,auVar91);
              auVar87 = vmulss_avx512f(auVar91,auVar91);
              auVar91 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar90._0_4_ * auVar87._0_4_)));
              auVar90 = vdpps_avx(auVar89,local_a10,0x7f);
              auVar92 = vfnmadd231ss_avx512f(auVar94,local_a40._0_16_,ZEXT416((uint)fVar191));
              auVar90 = vfnmadd231ss_avx512f(auVar90,local_a40._0_16_,auVar88);
              auVar94 = vpermilps_avx(local_7c0._0_16_,0xff);
              fVar189 = fVar189 - auVar94._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0xff);
              auVar94 = vfmsub213ss_fma(auVar92,auVar91,auVar87);
              auVar262._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar262._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar262._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_));
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar94._0_4_)),
                                        ZEXT416((uint)fVar191),auVar90);
              auVar94 = vinsertps_avx(auVar262,auVar90,0x1c);
              auVar249._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar249._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar191),auVar249,0x10);
              auVar231._0_4_ = auVar91._0_4_;
              auVar231._4_4_ = auVar231._0_4_;
              auVar231._8_4_ = auVar231._0_4_;
              auVar231._12_4_ = auVar231._0_4_;
              auVar88 = vdivps_avx(auVar94,auVar231);
              auVar94 = vdivps_avx(auVar90,auVar231);
              auVar90 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar232._0_4_ = auVar90._0_4_ * auVar88._0_4_ + fVar189 * auVar94._0_4_;
              auVar232._4_4_ = auVar90._4_4_ * auVar88._4_4_ + fVar189 * auVar94._4_4_;
              auVar232._8_4_ = auVar90._8_4_ * auVar88._8_4_ + fVar189 * auVar94._8_4_;
              auVar232._12_4_ = auVar90._12_4_ * auVar88._12_4_ + fVar189 * auVar94._12_4_;
              auVar88 = vsubps_avx(local_740._0_16_,auVar232);
              auVar166 = ZEXT1664(auVar88);
              auVar38._8_4_ = 0x7fffffff;
              auVar38._0_8_ = 0x7fffffff7fffffff;
              auVar38._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx512vl(local_a40._0_16_,auVar38);
              auVar94 = vucomiss_avx512f(auVar94);
              if (!(bool)uVar79 && !(bool)uVar80) {
                auVar94 = vaddss_avx512f(auVar93,auVar94);
                auVar94 = vfmadd231ss_fma(auVar94,local_980,ZEXT416(0x36000000));
                auVar39._8_4_ = 0x7fffffff;
                auVar39._0_8_ = 0x7fffffff7fffffff;
                auVar39._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx512vl(ZEXT416((uint)fVar189),auVar39);
                if (auVar90._0_4_ < auVar94._0_4_) {
                  fVar187 = auVar88._0_4_ + (float)local_990._0_4_;
                  if ((fVar187 < fVar153) ||
                     (fVar189 = *(float *)(ray + k * 4 + 0x200), fVar189 < fVar187)) break;
                  auVar88 = vmovshdup_avx(auVar88);
                  fVar191 = auVar88._0_4_;
                  if ((fVar191 < 0.0) || (1.0 < fVar191)) break;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_aa0._0_4_));
                  fVar154 = auVar88._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar76].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar154 = fVar154 * 1.5 +
                            (float)local_aa0._0_4_ * -0.5 * fVar154 * fVar154 * fVar154;
                  auVar233._0_4_ = auVar89._0_4_ * fVar154;
                  auVar233._4_4_ = auVar89._4_4_ * fVar154;
                  auVar233._8_4_ = auVar89._8_4_ * fVar154;
                  auVar233._12_4_ = auVar89._12_4_ * fVar154;
                  auVar94 = vfmadd213ps_fma(auVar87,auVar233,auVar86);
                  auVar88 = vshufps_avx(auVar233,auVar233,0xc9);
                  auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar234._0_4_ = auVar233._0_4_ * auVar89._0_4_;
                  auVar234._4_4_ = auVar233._4_4_ * auVar89._4_4_;
                  auVar234._8_4_ = auVar233._8_4_ * auVar89._8_4_;
                  auVar234._12_4_ = auVar233._12_4_ * auVar89._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar234,auVar86,auVar88);
                  auVar88 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar89 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar182._0_4_ = auVar94._0_4_ * auVar86._0_4_;
                  auVar182._4_4_ = auVar94._4_4_ * auVar86._4_4_;
                  auVar182._8_4_ = auVar94._8_4_ * auVar86._8_4_;
                  auVar182._12_4_ = auVar94._12_4_ * auVar86._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar182,auVar88,auVar89);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar187;
                    uVar169 = vextractps_avx(auVar88,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar169;
                    uVar169 = vextractps_avx(auVar88,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar169;
                    *(int *)(ray + k * 4 + 0x380) = auVar88._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar76;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar9 = context->user;
                  auVar243 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar243,auVar166);
                  auVar166 = vpermps_avx512f(auVar243,ZEXT1664(auVar88));
                  auVar243 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar243,ZEXT1664(auVar88));
                  local_380 = vbroadcastss_avx512f(auVar88);
                  local_400[0] = (RTCHitN)auVar166[0];
                  local_400[1] = (RTCHitN)auVar166[1];
                  local_400[2] = (RTCHitN)auVar166[2];
                  local_400[3] = (RTCHitN)auVar166[3];
                  local_400[4] = (RTCHitN)auVar166[4];
                  local_400[5] = (RTCHitN)auVar166[5];
                  local_400[6] = (RTCHitN)auVar166[6];
                  local_400[7] = (RTCHitN)auVar166[7];
                  local_400[8] = (RTCHitN)auVar166[8];
                  local_400[9] = (RTCHitN)auVar166[9];
                  local_400[10] = (RTCHitN)auVar166[10];
                  local_400[0xb] = (RTCHitN)auVar166[0xb];
                  local_400[0xc] = (RTCHitN)auVar166[0xc];
                  local_400[0xd] = (RTCHitN)auVar166[0xd];
                  local_400[0xe] = (RTCHitN)auVar166[0xe];
                  local_400[0xf] = (RTCHitN)auVar166[0xf];
                  local_400[0x10] = (RTCHitN)auVar166[0x10];
                  local_400[0x11] = (RTCHitN)auVar166[0x11];
                  local_400[0x12] = (RTCHitN)auVar166[0x12];
                  local_400[0x13] = (RTCHitN)auVar166[0x13];
                  local_400[0x14] = (RTCHitN)auVar166[0x14];
                  local_400[0x15] = (RTCHitN)auVar166[0x15];
                  local_400[0x16] = (RTCHitN)auVar166[0x16];
                  local_400[0x17] = (RTCHitN)auVar166[0x17];
                  local_400[0x18] = (RTCHitN)auVar166[0x18];
                  local_400[0x19] = (RTCHitN)auVar166[0x19];
                  local_400[0x1a] = (RTCHitN)auVar166[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar166[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar166[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar166[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar166[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar166[0x1f];
                  local_400[0x20] = (RTCHitN)auVar166[0x20];
                  local_400[0x21] = (RTCHitN)auVar166[0x21];
                  local_400[0x22] = (RTCHitN)auVar166[0x22];
                  local_400[0x23] = (RTCHitN)auVar166[0x23];
                  local_400[0x24] = (RTCHitN)auVar166[0x24];
                  local_400[0x25] = (RTCHitN)auVar166[0x25];
                  local_400[0x26] = (RTCHitN)auVar166[0x26];
                  local_400[0x27] = (RTCHitN)auVar166[0x27];
                  local_400[0x28] = (RTCHitN)auVar166[0x28];
                  local_400[0x29] = (RTCHitN)auVar166[0x29];
                  local_400[0x2a] = (RTCHitN)auVar166[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar166[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar166[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar166[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar166[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar166[0x2f];
                  local_400[0x30] = (RTCHitN)auVar166[0x30];
                  local_400[0x31] = (RTCHitN)auVar166[0x31];
                  local_400[0x32] = (RTCHitN)auVar166[0x32];
                  local_400[0x33] = (RTCHitN)auVar166[0x33];
                  local_400[0x34] = (RTCHitN)auVar166[0x34];
                  local_400[0x35] = (RTCHitN)auVar166[0x35];
                  local_400[0x36] = (RTCHitN)auVar166[0x36];
                  local_400[0x37] = (RTCHitN)auVar166[0x37];
                  local_400[0x38] = (RTCHitN)auVar166[0x38];
                  local_400[0x39] = (RTCHitN)auVar166[0x39];
                  local_400[0x3a] = (RTCHitN)auVar166[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar166[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar166[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar166[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar166[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar166[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar166 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar166);
                  auVar106 = vpcmpeqd_avx2(auVar166._0_32_,auVar166._0_32_);
                  local_a68[3] = auVar106;
                  local_a68[2] = auVar106;
                  local_a68[1] = auVar106;
                  *local_a68 = auVar106;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar187;
                  auVar166 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar166);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar7->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_b30);
                    auVar271 = ZEXT3264(local_b00);
                    auVar270 = ZEXT3264(local_ae0);
                    auVar269 = ZEXT3264(local_ac0);
                    auVar272 = ZEXT3264(local_a60);
                    auVar166 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar166,auVar166);
                  if ((short)uVar26 != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_b30);
                      auVar271 = ZEXT3264(local_b00);
                      auVar270 = ZEXT3264(local_ae0);
                      auVar269 = ZEXT3264(local_ac0);
                      auVar272 = ZEXT3264(local_a60);
                      auVar166 = vmovdqa64_avx512f(local_700);
                    }
                    uVar75 = vptestmd_avx512f(auVar166,auVar166);
                    if ((short)uVar75 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar52 = *(int *)(local_b30.hit + 0x10);
                      iVar53 = *(int *)(local_b30.hit + 0x14);
                      iVar54 = *(int *)(local_b30.hit + 0x18);
                      iVar55 = *(int *)(local_b30.hit + 0x1c);
                      iVar56 = *(int *)(local_b30.hit + 0x20);
                      iVar57 = *(int *)(local_b30.hit + 0x24);
                      iVar58 = *(int *)(local_b30.hit + 0x28);
                      iVar59 = *(int *)(local_b30.hit + 0x2c);
                      iVar60 = *(int *)(local_b30.hit + 0x30);
                      iVar61 = *(int *)(local_b30.hit + 0x34);
                      iVar62 = *(int *)(local_b30.hit + 0x38);
                      iVar63 = *(int *)(local_b30.hit + 0x3c);
                      bVar78 = (byte)uVar75;
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar69 = (byte)(uVar75 >> 8);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar78 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar69 & 1) * iVar56 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar52 = *(int *)(local_b30.hit + 0x50);
                      iVar53 = *(int *)(local_b30.hit + 0x54);
                      iVar54 = *(int *)(local_b30.hit + 0x58);
                      iVar55 = *(int *)(local_b30.hit + 0x5c);
                      iVar56 = *(int *)(local_b30.hit + 0x60);
                      iVar57 = *(int *)(local_b30.hit + 100);
                      iVar58 = *(int *)(local_b30.hit + 0x68);
                      iVar59 = *(int *)(local_b30.hit + 0x6c);
                      iVar60 = *(int *)(local_b30.hit + 0x70);
                      iVar61 = *(int *)(local_b30.hit + 0x74);
                      iVar62 = *(int *)(local_b30.hit + 0x78);
                      iVar63 = *(int *)(local_b30.hit + 0x7c);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar69 & 1) * iVar56 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar52 = *(int *)(local_b30.hit + 0x90);
                      iVar53 = *(int *)(local_b30.hit + 0x94);
                      iVar54 = *(int *)(local_b30.hit + 0x98);
                      iVar55 = *(int *)(local_b30.hit + 0x9c);
                      iVar56 = *(int *)(local_b30.hit + 0xa0);
                      iVar57 = *(int *)(local_b30.hit + 0xa4);
                      iVar58 = *(int *)(local_b30.hit + 0xa8);
                      iVar59 = *(int *)(local_b30.hit + 0xac);
                      iVar60 = *(int *)(local_b30.hit + 0xb0);
                      iVar61 = *(int *)(local_b30.hit + 0xb4);
                      iVar62 = *(int *)(local_b30.hit + 0xb8);
                      iVar63 = *(int *)(local_b30.hit + 0xbc);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar69 & 1) * iVar56 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar52 = *(int *)(local_b30.hit + 0xd0);
                      iVar53 = *(int *)(local_b30.hit + 0xd4);
                      iVar54 = *(int *)(local_b30.hit + 0xd8);
                      iVar55 = *(int *)(local_b30.hit + 0xdc);
                      iVar56 = *(int *)(local_b30.hit + 0xe0);
                      iVar57 = *(int *)(local_b30.hit + 0xe4);
                      iVar58 = *(int *)(local_b30.hit + 0xe8);
                      iVar59 = *(int *)(local_b30.hit + 0xec);
                      iVar60 = *(int *)(local_b30.hit + 0xf0);
                      iVar61 = *(int *)(local_b30.hit + 0xf4);
                      iVar62 = *(int *)(local_b30.hit + 0xf8);
                      iVar63 = *(int *)(local_b30.hit + 0xfc);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar69 & 1) * iVar56 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar52 = *(int *)(local_b30.hit + 0x110);
                      iVar53 = *(int *)(local_b30.hit + 0x114);
                      iVar54 = *(int *)(local_b30.hit + 0x118);
                      iVar55 = *(int *)(local_b30.hit + 0x11c);
                      iVar56 = *(int *)(local_b30.hit + 0x120);
                      iVar57 = *(int *)(local_b30.hit + 0x124);
                      iVar58 = *(int *)(local_b30.hit + 0x128);
                      iVar59 = *(int *)(local_b30.hit + 300);
                      iVar60 = *(int *)(local_b30.hit + 0x130);
                      iVar61 = *(int *)(local_b30.hit + 0x134);
                      iVar62 = *(int *)(local_b30.hit + 0x138);
                      iVar63 = *(int *)(local_b30.hit + 0x13c);
                      bVar10 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar75 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar75 >> 6) & 1);
                      bVar16 = (bool)((byte)(uVar75 >> 7) & 1);
                      bVar17 = (bool)((byte)(uVar75 >> 9) & 1);
                      bVar18 = (bool)((byte)(uVar75 >> 10) & 1);
                      bVar19 = (bool)((byte)(uVar75 >> 0xb) & 1);
                      bVar20 = (bool)((byte)(uVar75 >> 0xc) & 1);
                      bVar21 = (bool)((byte)(uVar75 >> 0xd) & 1);
                      bVar22 = (bool)((byte)(uVar75 >> 0xe) & 1);
                      bVar23 = SUB81(uVar75 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar10 * iVar3 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar11 * iVar4 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar16 * iVar55 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar69 & 1) * iVar56 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar17 * iVar57 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar18 * iVar58 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar19 * iVar59 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar20 * iVar60 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar21 * iVar61 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar22 * iVar62 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar23 * iVar63 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x43c);
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar166 = vmovdqu32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar166 = vmovdqu32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar166 = vmovdqa32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar166;
                      auVar166 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar166 = vmovdqa32_avx512f(auVar166);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar166;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar189;
                  break;
                }
              }
              lVar77 = lVar77 + -1;
            } while (lVar77 != 0);
            uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar164._4_4_ = uVar169;
            auVar164._0_4_ = uVar169;
            auVar164._8_4_ = uVar169;
            auVar164._12_4_ = uVar169;
            auVar164._16_4_ = uVar169;
            auVar164._20_4_ = uVar169;
            auVar164._24_4_ = uVar169;
            auVar164._28_4_ = uVar169;
            auVar65._4_4_ = fStack_67c;
            auVar65._0_4_ = local_680;
            auVar65._8_4_ = fStack_678;
            auVar65._12_4_ = fStack_674;
            auVar65._16_4_ = fStack_670;
            auVar65._20_4_ = fStack_66c;
            auVar65._24_4_ = fStack_668;
            auVar65._28_4_ = fStack_664;
            uVar26 = vcmpps_avx512vl(auVar164,auVar65,0xd);
            bVar71 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar71 & (byte)uVar26;
          } while (bVar71 != 0);
          auVar143 = local_6a0;
          fVar167 = (float)local_9e0._0_4_;
          fVar187 = (float)local_9e0._4_4_;
          fVar189 = fStack_9d8;
          fVar191 = fStack_9d4;
          fVar154 = fStack_9d0;
          fVar193 = fStack_9cc;
          fVar195 = fStack_9c8;
          fVar197 = fStack_9c4;
        }
        auVar243 = ZEXT3264(local_a00);
        uVar27 = vpcmpgtd_avx512vl(auVar143,local_640);
        uVar28 = vpcmpd_avx512vl(local_640,local_5c0,1);
        auVar219._0_4_ = fVar167 + (float)local_540._0_4_;
        auVar219._4_4_ = fVar187 + (float)local_540._4_4_;
        auVar219._8_4_ = fVar189 + fStack_538;
        auVar219._12_4_ = fVar191 + fStack_534;
        auVar219._16_4_ = fVar154 + fStack_530;
        auVar219._20_4_ = fVar193 + fStack_52c;
        auVar219._24_4_ = fVar195 + fStack_528;
        auVar219._28_4_ = fVar197 + fStack_524;
        uVar26 = vcmpps_avx512vl(auVar219,auVar164,2);
        bVar72 = bVar72 & (byte)uVar28 & (byte)uVar26;
        auVar220._0_4_ = fVar167 + local_620._0_4_;
        auVar220._4_4_ = fVar187 + local_620._4_4_;
        auVar220._8_4_ = fVar189 + local_620._8_4_;
        auVar220._12_4_ = fVar191 + local_620._12_4_;
        auVar220._16_4_ = fVar154 + local_620._16_4_;
        auVar220._20_4_ = fVar193 + local_620._20_4_;
        auVar220._24_4_ = fVar195 + local_620._24_4_;
        auVar220._28_4_ = fVar197 + local_620._28_4_;
        uVar26 = vcmpps_avx512vl(auVar220,auVar164,2);
        bVar67 = bVar67 & (byte)uVar27 & (byte)uVar26 | bVar72;
        auVar259 = ZEXT3264(local_880);
        prim = local_930;
        if (bVar67 != 0) {
          abStack_1a0[uVar73 * 0x60] = bVar67;
          auVar145._0_4_ =
               (uint)(bVar72 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar72 & 1) * (int)local_620._0_4_;
          bVar10 = (bool)(bVar72 >> 1 & 1);
          auVar145._4_4_ = (uint)bVar10 * local_540._4_4_ | (uint)!bVar10 * (int)local_620._4_4_;
          bVar10 = (bool)(bVar72 >> 2 & 1);
          auVar145._8_4_ = (uint)bVar10 * (int)fStack_538 | (uint)!bVar10 * (int)local_620._8_4_;
          bVar10 = (bool)(bVar72 >> 3 & 1);
          auVar145._12_4_ = (uint)bVar10 * (int)fStack_534 | (uint)!bVar10 * (int)local_620._12_4_;
          bVar10 = (bool)(bVar72 >> 4 & 1);
          auVar145._16_4_ = (uint)bVar10 * (int)fStack_530 | (uint)!bVar10 * (int)local_620._16_4_;
          bVar10 = (bool)(bVar72 >> 5 & 1);
          auVar145._20_4_ = (uint)bVar10 * (int)fStack_52c | (uint)!bVar10 * (int)local_620._20_4_;
          auVar145._24_4_ =
               (uint)(bVar72 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar72 >> 6) * (int)local_620._24_4_;
          auVar145._28_4_ = local_620._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar73 * 0x60) = auVar145;
          uVar75 = vmovlps_avx(local_650);
          (&uStack_160)[uVar73 * 0xc] = uVar75;
          aiStack_158[uVar73 * 0x18] = iVar74 + 1;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
      }
    }
    do {
      uVar82 = (uint)uVar73;
      uVar73 = (ulong)(uVar82 - 1);
      if (uVar82 == 0) {
        uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar40._4_4_ = uVar169;
        auVar40._0_4_ = uVar169;
        auVar40._8_4_ = uVar169;
        auVar40._12_4_ = uVar169;
        uVar26 = vcmpps_avx512vl(local_660,auVar40,2);
        uVar76 = (uint)local_928 & (uint)uVar26;
        local_928 = (ulong)uVar76;
        if (uVar76 == 0) {
          return;
        }
        goto LAB_01afcec9;
      }
      lVar77 = uVar73 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_180 + lVar77);
      auVar183._0_4_ = fVar167 + auVar106._0_4_;
      auVar183._4_4_ = fVar187 + auVar106._4_4_;
      auVar183._8_4_ = fVar189 + auVar106._8_4_;
      auVar183._12_4_ = fVar191 + auVar106._12_4_;
      auVar183._16_4_ = fVar154 + auVar106._16_4_;
      auVar183._20_4_ = fVar193 + auVar106._20_4_;
      auVar183._24_4_ = fVar195 + auVar106._24_4_;
      auVar183._28_4_ = fVar197 + auVar106._28_4_;
      uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar43._4_4_ = uVar169;
      auVar43._0_4_ = uVar169;
      auVar43._8_4_ = uVar169;
      auVar43._12_4_ = uVar169;
      auVar43._16_4_ = uVar169;
      auVar43._20_4_ = uVar169;
      auVar43._24_4_ = uVar169;
      auVar43._28_4_ = uVar169;
      uVar26 = vcmpps_avx512vl(auVar183,auVar43,2);
      uVar81 = (uint)uVar26 & (uint)abStack_1a0[lVar77];
    } while (uVar81 == 0);
    uVar75 = (&uStack_160)[uVar73 * 0xc];
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar75;
    auVar217._8_4_ = 0x7f800000;
    auVar217._0_8_ = 0x7f8000007f800000;
    auVar217._12_4_ = 0x7f800000;
    auVar217._16_4_ = 0x7f800000;
    auVar217._20_4_ = 0x7f800000;
    auVar217._24_4_ = 0x7f800000;
    auVar217._28_4_ = 0x7f800000;
    auVar108 = vblendmps_avx512vl(auVar217,auVar106);
    bVar67 = (byte)uVar81;
    auVar141._0_4_ =
         (uint)(bVar67 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar106._0_4_;
    bVar10 = (bool)((byte)(uVar81 >> 1) & 1);
    auVar141._4_4_ = (uint)bVar10 * auVar108._4_4_ | (uint)!bVar10 * (int)auVar106._4_4_;
    bVar10 = (bool)((byte)(uVar81 >> 2) & 1);
    auVar141._8_4_ = (uint)bVar10 * auVar108._8_4_ | (uint)!bVar10 * (int)auVar106._8_4_;
    bVar10 = (bool)((byte)(uVar81 >> 3) & 1);
    auVar141._12_4_ = (uint)bVar10 * auVar108._12_4_ | (uint)!bVar10 * (int)auVar106._12_4_;
    bVar10 = (bool)((byte)(uVar81 >> 4) & 1);
    auVar141._16_4_ = (uint)bVar10 * auVar108._16_4_ | (uint)!bVar10 * (int)auVar106._16_4_;
    bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
    auVar141._20_4_ = (uint)bVar10 * auVar108._20_4_ | (uint)!bVar10 * (int)auVar106._20_4_;
    bVar10 = (bool)((byte)(uVar81 >> 6) & 1);
    auVar141._24_4_ = (uint)bVar10 * auVar108._24_4_ | (uint)!bVar10 * (int)auVar106._24_4_;
    auVar141._28_4_ =
         (uVar81 >> 7) * auVar108._28_4_ | (uint)!SUB41(uVar81 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar141,auVar141,0xb1);
    auVar106 = vminps_avx(auVar141,auVar106);
    auVar108 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar108);
    auVar108 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar108);
    uVar26 = vcmpps_avx512vl(auVar141,auVar106,0);
    bVar71 = (byte)uVar26 & bVar67;
    if (bVar71 != 0) {
      uVar81 = (uint)bVar71;
    }
    uVar146 = 0;
    for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
      uVar146 = uVar146 + 1;
    }
    iVar74 = aiStack_158[uVar73 * 0x18];
    bVar67 = ~('\x01' << ((byte)uVar146 & 0x1f)) & bVar67;
    abStack_1a0[lVar77] = bVar67;
    if (bVar67 == 0) {
      uVar82 = uVar82 - 1;
    }
    uVar169 = (undefined4)uVar75;
    auVar161._4_4_ = uVar169;
    auVar161._0_4_ = uVar169;
    auVar161._8_4_ = uVar169;
    auVar161._12_4_ = uVar169;
    auVar161._16_4_ = uVar169;
    auVar161._20_4_ = uVar169;
    auVar161._24_4_ = uVar169;
    auVar161._28_4_ = uVar169;
    auVar88 = vmovshdup_avx(auVar172);
    auVar88 = vsubps_avx(auVar88,auVar172);
    auVar184._0_4_ = auVar88._0_4_;
    auVar184._4_4_ = auVar184._0_4_;
    auVar184._8_4_ = auVar184._0_4_;
    auVar184._12_4_ = auVar184._0_4_;
    auVar184._16_4_ = auVar184._0_4_;
    auVar184._20_4_ = auVar184._0_4_;
    auVar184._24_4_ = auVar184._0_4_;
    auVar184._28_4_ = auVar184._0_4_;
    auVar88 = vfmadd132ps_fma(auVar184,auVar161,_DAT_01faff20);
    auVar106 = ZEXT1632(auVar88);
    local_400[0] = (RTCHitN)auVar106[0];
    local_400[1] = (RTCHitN)auVar106[1];
    local_400[2] = (RTCHitN)auVar106[2];
    local_400[3] = (RTCHitN)auVar106[3];
    local_400[4] = (RTCHitN)auVar106[4];
    local_400[5] = (RTCHitN)auVar106[5];
    local_400[6] = (RTCHitN)auVar106[6];
    local_400[7] = (RTCHitN)auVar106[7];
    local_400[8] = (RTCHitN)auVar106[8];
    local_400[9] = (RTCHitN)auVar106[9];
    local_400[10] = (RTCHitN)auVar106[10];
    local_400[0xb] = (RTCHitN)auVar106[0xb];
    local_400[0xc] = (RTCHitN)auVar106[0xc];
    local_400[0xd] = (RTCHitN)auVar106[0xd];
    local_400[0xe] = (RTCHitN)auVar106[0xe];
    local_400[0xf] = (RTCHitN)auVar106[0xf];
    local_400[0x10] = (RTCHitN)auVar106[0x10];
    local_400[0x11] = (RTCHitN)auVar106[0x11];
    local_400[0x12] = (RTCHitN)auVar106[0x12];
    local_400[0x13] = (RTCHitN)auVar106[0x13];
    local_400[0x14] = (RTCHitN)auVar106[0x14];
    local_400[0x15] = (RTCHitN)auVar106[0x15];
    local_400[0x16] = (RTCHitN)auVar106[0x16];
    local_400[0x17] = (RTCHitN)auVar106[0x17];
    local_400[0x18] = (RTCHitN)auVar106[0x18];
    local_400[0x19] = (RTCHitN)auVar106[0x19];
    local_400[0x1a] = (RTCHitN)auVar106[0x1a];
    local_400[0x1b] = (RTCHitN)auVar106[0x1b];
    local_400[0x1c] = (RTCHitN)auVar106[0x1c];
    local_400[0x1d] = (RTCHitN)auVar106[0x1d];
    local_400[0x1e] = (RTCHitN)auVar106[0x1e];
    local_400[0x1f] = (RTCHitN)auVar106[0x1f];
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_400 + (ulong)uVar146 * 4);
    uVar73 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }